

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_avx2.c
# Opt level: O2

void av1_compute_stats_avx2
               (int wiener_win,uint8_t *dgd,uint8_t *src,int16_t *dgd_avg,int16_t *src_avg,
               int h_start,int h_end,int v_start,int v_end,int dgd_stride,int src_stride,int64_t *M,
               int64_t *H,int use_downsampled_wiener_stats)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  __m256i src0;
  __m256i src0_00;
  __m256i src0_01;
  __m256i src0_02;
  __m256i src1;
  __m256i src1_00;
  __m256i src1_01;
  __m256i src1_02;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  uint8_t *puVar12;
  long lVar13;
  undefined1 (*pauVar14) [32];
  int16_t *piVar15;
  int16_t *piVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  undefined1 (*pauVar20) [32];
  uint8_t avg;
  uint uVar21;
  int iVar22;
  long lVar23;
  ulong uVar24;
  int16_t *piVar25;
  long lVar26;
  uint8_t *puVar27;
  long lVar28;
  int64_t *piVar29;
  int iVar30;
  int iVar31;
  ulong uVar32;
  ulong uVar33;
  int32_t proc_wd;
  int iVar34;
  long lVar35;
  long lVar36;
  int iVar37;
  uint uVar38;
  uint dst_stride;
  uint uVar39;
  uint uVar40;
  long lVar41;
  int64_t iVar42;
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  int64_t iVar52;
  undefined1 in_ZMM0 [64];
  undefined1 auVar51 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [64];
  undefined1 auVar72 [32];
  int i;
  int i_2;
  int i_3;
  int32_t wiener_win2;
  undefined4 uVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  undefined4 uVar76;
  undefined4 uVar77;
  int64_t *piVar78;
  undefined4 uVar79;
  undefined1 in_stack_fffffffffffffd38;
  byte bVar80;
  undefined1 uVar81;
  undefined7 in_stack_fffffffffffffd39;
  undefined7 uVar82;
  int7 iVar83;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  int64_t *local_1c8;
  undefined1 local_1c0 [16];
  int64_t iStack_1b0;
  int64_t iStack_1a8;
  long local_188;
  undefined1 local_180 [32];
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined1 local_80 [32];
  
  if ((wiener_win & 0xfffffffdU) == 5) {
    puVar27 = dgd + h_start;
    uVar39 = h_end - h_start;
    uVar21 = uVar39 & 0x1f;
    if (uVar21 < 0x10) {
      auVar1 = *(undefined1 (*) [16])(mask_8bit + (0x10 - (ulong)uVar21));
      auVar53 = (undefined1  [16])0x0;
    }
    else {
      auVar53 = *(undefined1 (*) [16])((long)mask_16bit - (ulong)uVar21);
      auVar1 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    }
    uVar18 = (uint)wiener_win >> 1;
    puVar12 = puVar27 + dgd_stride * v_start;
    iVar37 = v_end - v_start;
    auVar43._0_16_ = ZEXT116(0) * auVar53 + ZEXT116(1) * auVar1;
    auVar43._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar53;
    iVar31 = 0;
    auVar71 = ZEXT1664((undefined1  [16])0x0);
    do {
      lVar35 = 0;
      while( true ) {
        if ((int)(uVar39 & 0xffffffe0) <= lVar35) break;
        auVar46 = vpsadbw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                               *(undefined1 (*) [32])(puVar12 + lVar35));
        auVar46 = vpaddd_avx2(auVar71._0_32_,auVar46);
        auVar71 = ZEXT3264(auVar46);
        lVar35 = lVar35 + 0x20;
      }
      if (uVar21 != 0) {
        auVar46 = vpand_avx2(auVar43,*(undefined1 (*) [32])(puVar12 + lVar35));
        auVar46 = vpsadbw_avx2(auVar46,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
        auVar46 = vpaddd_avx2(auVar71._0_32_,auVar46);
        auVar71 = ZEXT3264(auVar46);
      }
      puVar12 = puVar12 + dgd_stride;
      iVar31 = iVar31 + 1;
    } while (iVar31 < iVar37);
    auVar53 = vphaddd_avx(auVar71._16_16_,auVar71._0_16_);
    auVar53 = vphaddd_avx(auVar53,auVar53);
    auVar53 = vphaddd_avx(auVar53,auVar53);
    uVar40 = wiener_win & 6;
    iVar31 = uVar39 + uVar40;
    local_180._0_4_ = iVar37;
    uVar38 = uVar39 + uVar40 + 0xf;
    dst_stride = uVar38 & 0xfffffff0;
    uVar21 = uVar39 + 0xf & 0xfffffff0;
    avg = (uint8_t)(auVar53._0_4_ / (iVar37 * uVar39));
    uVar74 = 0;
    sub_avg_block_avx2(src + (long)(src_stride * v_start) + (long)h_start,src_stride,avg,uVar39,
                       iVar37,src_avg,uVar21,use_downsampled_wiener_stats);
    uVar79 = (undefined4)((ulong)puVar27 >> 0x20);
    sub_avg_block_avx2(puVar27 + ((long)(int)((v_start - uVar18) * dgd_stride) - (ulong)uVar18),
                       dgd_stride,avg,iVar31,uVar40 + local_180._0_4_,dgd_avg,dst_stride,0);
    uVar33 = CONCAT44(uVar74,uVar21);
    iVar31 = (int)uVar38 >> 0x1f;
    if (wiener_win == 5) {
      uVar18 = uVar39 & 0xf;
      auVar71 = ZEXT3264(*(undefined1 (*) [32])(mask_16bit + (0x10 - uVar18)));
      iVar37 = (uint)(use_downsampled_wiener_stats != 0) * 3 + 1;
      lVar28 = (long)(int)(uVar39 & 0xfffffff0);
      lVar35 = ((long)(int)uVar38 & 0xfffffffffffffff0U) * 2;
      lVar13 = 0;
      lVar23 = 0;
      local_180 = *(undefined1 (*) [32])(mask_16bit + (0x10 - uVar18));
      uVar39 = dst_stride;
      do {
        uVar73 = (undefined4)lVar23;
        uVar75 = (undefined4)((ulong)lVar23 >> 0x20);
        local_240._0_16_ = ZEXT816(0);
        local_240 = ZEXT1632(local_240._0_16_);
        local_260._0_16_ = ZEXT816(0);
        local_260 = ZEXT1632(local_260._0_16_);
        local_280._0_16_ = ZEXT816(0);
        local_280 = ZEXT1632(local_280._0_16_);
        local_2a0._0_16_ = ZEXT816(0);
        local_2a0 = ZEXT1632(local_2a0._0_16_);
        local_2c0._0_16_ = ZEXT816(0);
        local_2c0 = ZEXT1632(local_2c0._0_16_);
        local_e0 = 0;
        uStack_d8 = 0;
        uStack_d0 = 0;
        uStack_c8 = 0;
        local_100 = 0;
        uStack_f8 = 0;
        uStack_f0 = 0;
        uStack_e8 = 0;
        local_120 = 0;
        uStack_118 = 0;
        uStack_110 = 0;
        uStack_108 = 0;
        local_140 = 0;
        uStack_138 = 0;
        uStack_130 = 0;
        uStack_128 = 0;
        local_160 = 0;
        uStack_158 = 0;
        uStack_150 = 0;
        uStack_148 = 0;
        piVar16 = dgd_avg;
        piVar29 = (int64_t *)src_avg;
        iVar22 = v_start;
        iVar34 = iVar37;
        do {
          iVar30 = v_end - iVar22;
          if (3 < v_end - iVar22) {
            iVar30 = iVar34;
          }
          if (use_downsampled_wiener_stats == 0) {
            iVar30 = iVar34;
          }
          iVar34 = iVar30;
          auVar46._0_2_ = (undefined2)iVar34;
          auVar46._2_2_ = auVar46._0_2_;
          auVar46._4_2_ = auVar46._0_2_;
          auVar46._6_2_ = auVar46._0_2_;
          auVar46._8_2_ = auVar46._0_2_;
          auVar46._10_2_ = auVar46._0_2_;
          auVar46._12_2_ = auVar46._0_2_;
          auVar46._14_2_ = auVar46._0_2_;
          auVar46._16_2_ = auVar46._0_2_;
          auVar46._18_2_ = auVar46._0_2_;
          auVar46._20_2_ = auVar46._0_2_;
          auVar46._22_2_ = auVar46._0_2_;
          auVar46._24_2_ = auVar46._0_2_;
          auVar46._26_2_ = auVar46._0_2_;
          auVar46._28_2_ = auVar46._0_2_;
          auVar46._30_2_ = auVar46._0_2_;
          pauVar14 = (undefined1 (*) [32])((long)piVar16 + lVar13);
          for (uVar33 = 0; (long)uVar33 < lVar28; uVar33 = uVar33 + 0x10) {
            auVar43 = vpmullw_avx2(auVar46,*(undefined1 (*) [32])((long)piVar29 + uVar33 * 2));
            auVar50 = vpmullw_avx2(auVar46,*(undefined1 (*) [32])(piVar16 + uVar33));
            pauVar20 = pauVar14;
            for (lVar41 = 0; lVar41 != 0xa0; lVar41 = lVar41 + 0x20) {
              auVar2 = vpmaddwd_avx2(auVar43,*pauVar20);
              auVar2 = vpaddd_avx2(auVar2,*(undefined1 (*) [32])(local_2c0 + lVar41));
              auVar3 = vpmaddwd_avx2(auVar50,*pauVar20);
              auVar3 = vpaddd_avx2(auVar3,*(undefined1 (*) [32])((long)&local_160 + lVar41));
              *(undefined1 (*) [32])(local_2c0 + lVar41) = auVar2;
              *(undefined1 (*) [32])((long)&local_160 + lVar41) = auVar3;
              pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar35);
            }
            pauVar14 = pauVar14 + 1;
          }
          if (uVar18 != 0) {
            auVar43 = vpand_avx2(auVar71._0_32_,
                                 *(undefined1 (*) [32])((long)piVar29 + (uVar33 & 0xffffffff) * 2));
            auVar50 = vpand_avx2(auVar71._0_32_,
                                 *(undefined1 (*) [32])(piVar16 + (uVar33 & 0xffffffff)));
            auVar43 = vpmullw_avx2(auVar46,auVar43);
            auVar46 = vpmullw_avx2(auVar46,auVar50);
            for (lVar41 = 0; lVar41 != 0xa0; lVar41 = lVar41 + 0x20) {
              auVar50 = vpmaddwd_avx2(auVar43,*pauVar14);
              auVar50 = vpaddd_avx2(auVar50,*(undefined1 (*) [32])(local_2c0 + lVar41));
              auVar2 = vpmaddwd_avx2(auVar46,*pauVar14);
              auVar2 = vpaddd_avx2(auVar2,*(undefined1 (*) [32])((long)&local_160 + lVar41));
              *(undefined1 (*) [32])(local_2c0 + lVar41) = auVar50;
              *(undefined1 (*) [32])((long)&local_160 + lVar41) = auVar2;
              pauVar14 = (undefined1 (*) [32])(*pauVar14 + lVar35);
            }
          }
          iVar22 = iVar22 + iVar34;
          piVar29 = (int64_t *)((long)piVar29 + (long)(int)(iVar34 * uVar21) * 2);
          piVar16 = piVar16 + (int)(iVar34 * dst_stride);
        } while (iVar22 < v_end);
        auVar53 = local_240._0_16_;
        auVar43 = vphaddd_avx2(local_2c0,local_2a0);
        auVar46 = vphaddd_avx2(local_280,local_260);
        auVar43 = vphaddd_avx2(auVar43,auVar46);
        auVar46 = vpmovsxdq_avx2(auVar43._0_16_);
        auVar43 = vpmovsxdq_avx2(auVar43._16_16_);
        _local_1c0 = vpaddq_avx2(auVar46,auVar43);
        uVar76 = (undefined4)lVar13;
        uVar77 = (undefined4)((ulong)lVar13 >> 0x20);
        src0_00[1]._0_4_ = uVar39;
        src0_00[0] = lVar23;
        src0_00[1]._4_4_ = iVar31;
        src0_00[2]._0_4_ = uVar76;
        src0_00[2]._4_4_ = uVar77;
        src0_00[3] = (longlong)src_avg;
        src1_00[0]._4_4_ = uVar74;
        src1_00[0]._0_4_ = uVar21;
        src1_00[1]._0_4_ = iVar37;
        src1_00[1]._4_4_ = uVar79;
        src1_00[2] = (longlong)dgd_avg;
        src1_00[3]._0_1_ = in_stack_fffffffffffffd38;
        src1_00[3]._1_7_ = in_stack_fffffffffffffd39;
        convert_32_to_64_add_avx2(src0_00,src1_00);
        auVar47 = local_180;
        uVar33 = CONCAT44(uVar74,uVar21);
        auVar71 = ZEXT3264(local_180);
        lVar23 = CONCAT44(uVar75,uVar73);
        piVar29 = M + lVar23 * 5;
        *piVar29 = local_1c0._0_8_;
        piVar29[1] = local_1c0._8_8_;
        piVar29[2] = iStack_1b0;
        piVar29[3] = iStack_1a8;
        M[lVar23 * 5 + 4] = auVar53._0_8_;
        auVar50._8_8_ = uStack_158;
        auVar50._0_8_ = local_160;
        auVar50._16_8_ = uStack_150;
        auVar50._24_8_ = uStack_148;
        auVar3._8_8_ = uStack_118;
        auVar3._0_8_ = local_120;
        auVar3._16_8_ = uStack_110;
        auVar3._24_8_ = uStack_108;
        auVar2._8_8_ = uStack_138;
        auVar2._0_8_ = local_140;
        auVar2._16_8_ = uStack_130;
        auVar2._24_8_ = uStack_128;
        auVar43 = vphaddd_avx2(auVar50,auVar2);
        auVar8._8_8_ = uStack_f8;
        auVar8._0_8_ = local_100;
        auVar8._16_8_ = uStack_f0;
        auVar8._24_8_ = uStack_e8;
        auVar46 = vphaddd_avx2(auVar3,auVar8);
        auVar43 = vphaddd_avx2(auVar43,auVar46);
        auVar46 = vpmovsxdq_avx2(auVar43._0_16_);
        auVar43 = vpmovsxdq_avx2(auVar43._16_16_);
        auVar43 = vpaddq_avx2(auVar46,auVar43);
        *(undefined1 (*) [32])(H + lVar23 * 5) = auVar43;
        iVar42 = vpextrq_avx(auVar53,1);
        H[lVar23 * 5 + 4] = iVar42;
        lVar23 = lVar23 + 1;
        lVar13 = CONCAT44(uVar77,uVar76) + 2;
      } while (lVar23 != 5);
      lVar23 = 1;
      uVar81 = 2;
      uVar82 = 0;
      lVar13 = 0;
      while (lVar13 != 5) {
        local_1c0._0_8_ = lVar13;
        piVar16 = dgd_avg + (byte)(((ushort)lVar23 & 0xff) / 5);
        src_avg = piVar16 + CONCAT44(iVar31,uVar39);
        local_240._0_16_ = ZEXT816(0);
        local_240 = ZEXT1632(local_240._0_16_);
        local_260._0_16_ = ZEXT816(0);
        local_260 = ZEXT1632(local_260._0_16_);
        local_280._0_16_ = ZEXT816(0);
        local_280 = ZEXT1632(local_280._0_16_);
        local_2a0._0_16_ = ZEXT816(0);
        local_2a0 = ZEXT1632(local_2a0._0_16_);
        local_2c0._0_16_ = ZEXT816(0);
        local_2c0 = ZEXT1632(local_2c0._0_16_);
        piVar29 = (int64_t *)src_avg;
        iVar22 = v_start;
        iVar34 = iVar37;
        do {
          iVar30 = v_end - iVar22;
          if (3 < v_end - iVar22) {
            iVar30 = iVar34;
          }
          if (use_downsampled_wiener_stats == 0) {
            iVar30 = iVar34;
          }
          iVar34 = iVar30;
          auVar55._0_2_ = (undefined2)iVar34;
          auVar55._2_2_ = auVar55._0_2_;
          auVar55._4_2_ = auVar55._0_2_;
          auVar55._6_2_ = auVar55._0_2_;
          auVar55._8_2_ = auVar55._0_2_;
          auVar55._10_2_ = auVar55._0_2_;
          auVar55._12_2_ = auVar55._0_2_;
          auVar55._14_2_ = auVar55._0_2_;
          auVar55._16_2_ = auVar55._0_2_;
          auVar55._18_2_ = auVar55._0_2_;
          auVar55._20_2_ = auVar55._0_2_;
          auVar55._22_2_ = auVar55._0_2_;
          auVar55._24_2_ = auVar55._0_2_;
          auVar55._26_2_ = auVar55._0_2_;
          auVar55._28_2_ = auVar55._0_2_;
          auVar55._30_2_ = auVar55._0_2_;
          pauVar14 = (undefined1 (*) [32])(piVar16 + CONCAT44(iVar31,uVar39));
          for (uVar32 = 0; (long)uVar32 < lVar28; uVar32 = uVar32 + 0x10) {
            auVar43 = vpmullw_avx2(auVar55,*(undefined1 (*) [32])((long)piVar29 + uVar32 * 2));
            pauVar20 = pauVar14;
            for (lVar13 = 0; lVar13 != 0x80; lVar13 = lVar13 + 0x20) {
              auVar46 = vpmaddwd_avx2(auVar43,*pauVar20);
              auVar46 = vpaddd_avx2(auVar46,*(undefined1 (*) [32])(local_2c0 + lVar13));
              *(undefined1 (*) [32])(local_2c0 + lVar13) = auVar46;
              pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar35);
            }
            pauVar14 = pauVar14 + 1;
          }
          if (uVar18 != 0) {
            auVar43 = vpand_avx2(auVar47,*(undefined1 (*) [32])
                                          ((long)piVar29 + (uVar32 & 0xffffffff) * 2));
            auVar43 = vpmullw_avx2(auVar55,auVar43);
            for (lVar13 = 0; lVar13 != 0x80; lVar13 = lVar13 + 0x20) {
              auVar46 = vpmaddwd_avx2(auVar43,*pauVar14);
              auVar46 = vpaddd_avx2(auVar46,*(undefined1 (*) [32])(local_2c0 + lVar13));
              *(undefined1 (*) [32])(local_2c0 + lVar13) = auVar46;
              pauVar14 = (undefined1 (*) [32])(*pauVar14 + lVar35);
            }
          }
          iVar22 = iVar22 + iVar34;
          piVar16 = piVar16 + (int)(iVar34 * dst_stride);
          piVar29 = (int64_t *)((long)piVar29 + (long)(int)(iVar34 * dst_stride) * 2);
        } while (iVar22 < v_end);
        auVar43 = vphaddd_avx2(local_2c0,local_2a0);
        auVar46 = vphaddd_avx2(local_280,local_260);
        auVar43 = vphaddd_avx2(auVar43,auVar46);
        auVar46 = vpmovsxdq_avx2(auVar43._0_16_);
        auVar43 = vpmovsxdq_avx2(auVar43._16_16_);
        auVar43 = vpaddq_avx2(auVar46,auVar43);
        *(undefined1 (*) [32])(H + lVar23 * 0x1a) = auVar43;
        lVar13 = CONCAT71(uVar82,uVar81);
        uVar32 = local_1c0._0_8_;
        while (uVar32 < 4) {
          uVar32 = uVar32 + 1;
          local_240._0_16_ = ZEXT816(0);
          local_240 = ZEXT1632(local_240._0_16_);
          local_260._0_16_ = ZEXT816(0);
          local_260 = ZEXT1632(local_260._0_16_);
          local_280._0_16_ = ZEXT816(0);
          local_280 = ZEXT1632(local_280._0_16_);
          local_2a0._0_16_ = ZEXT816(0);
          local_2a0 = ZEXT1632(local_2a0._0_16_);
          local_2c0._0_16_ = ZEXT816(0);
          local_2c0 = ZEXT1632(local_2c0._0_16_);
          piVar29 = (int64_t *)src_avg;
          piVar16 = dgd_avg;
          iVar22 = iVar37;
          iVar34 = v_start;
          do {
            iVar30 = v_end - iVar34;
            if (3 < v_end - iVar34) {
              iVar30 = iVar22;
            }
            if (use_downsampled_wiener_stats == 0) {
              iVar30 = iVar22;
            }
            iVar22 = iVar30;
            auVar56._0_2_ = (undefined2)iVar22;
            auVar56._2_2_ = auVar56._0_2_;
            auVar56._4_2_ = auVar56._0_2_;
            auVar56._6_2_ = auVar56._0_2_;
            auVar56._8_2_ = auVar56._0_2_;
            auVar56._10_2_ = auVar56._0_2_;
            auVar56._12_2_ = auVar56._0_2_;
            auVar56._14_2_ = auVar56._0_2_;
            auVar56._16_2_ = auVar56._0_2_;
            auVar56._18_2_ = auVar56._0_2_;
            auVar56._20_2_ = auVar56._0_2_;
            auVar56._22_2_ = auVar56._0_2_;
            auVar56._24_2_ = auVar56._0_2_;
            auVar56._26_2_ = auVar56._0_2_;
            auVar56._28_2_ = auVar56._0_2_;
            auVar56._30_2_ = auVar56._0_2_;
            pauVar14 = (undefined1 (*) [32])((long)piVar16 + lVar13);
            for (uVar33 = 0; (long)uVar33 < lVar28; uVar33 = uVar33 + 0x10) {
              auVar43 = vpmullw_avx2(auVar56,*(undefined1 (*) [32])((long)piVar29 + uVar33 * 2));
              pauVar20 = pauVar14;
              for (lVar41 = 0; lVar41 != 0xa0; lVar41 = lVar41 + 0x20) {
                auVar46 = vpmaddwd_avx2(auVar43,*pauVar20);
                auVar46 = vpaddd_avx2(auVar46,*(undefined1 (*) [32])(local_2c0 + lVar41));
                *(undefined1 (*) [32])(local_2c0 + lVar41) = auVar46;
                pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar35);
              }
              pauVar14 = pauVar14 + 1;
            }
            if (uVar18 != 0) {
              auVar43 = vpand_avx2(auVar47,*(undefined1 (*) [32])
                                            ((long)piVar29 + (uVar33 & 0xffffffff) * 2));
              auVar43 = vpmullw_avx2(auVar56,auVar43);
              for (lVar41 = 0; lVar41 != 0xa0; lVar41 = lVar41 + 0x20) {
                auVar46 = vpmaddwd_avx2(auVar43,*pauVar14);
                auVar46 = vpaddd_avx2(auVar46,*(undefined1 (*) [32])(local_2c0 + lVar41));
                *(undefined1 (*) [32])(local_2c0 + lVar41) = auVar46;
                pauVar14 = (undefined1 (*) [32])(*pauVar14 + lVar35);
              }
            }
            iVar34 = iVar34 + iVar22;
            piVar16 = piVar16 + (int)(iVar22 * dst_stride);
            piVar29 = (int64_t *)((long)piVar29 + (long)(int)(iVar22 * dst_stride) * 2);
          } while (iVar34 < v_end);
          auVar43 = vphaddd_avx2(local_2c0,local_2a0);
          auVar46 = vphaddd_avx2(local_280,local_260);
          auVar43 = vphaddd_avx2(auVar43,auVar46);
          auVar46 = vpmovsxdq_avx2(auVar43._0_16_);
          auVar43 = vpmovsxdq_avx2(auVar43._16_16_);
          auVar43 = vpaddq_avx2(auVar46,auVar43);
          *(undefined1 (*) [32])(H + lVar23 * 0x19 + uVar32 * 5) = auVar43;
          auVar43 = vpmovsxdq_avx2(local_240._0_16_);
          auVar46 = vpmovsxdq_avx2(local_240._16_16_);
          auVar43 = vpaddq_avx2(auVar43,auVar46);
          auVar46 = vpshufd_avx2(auVar43,0x44);
          auVar43 = vpshufd_avx2(auVar43,0xee);
          auVar43 = vpaddq_avx2(auVar46,auVar43);
          auVar53 = vpaddq_avx(auVar43._0_16_,auVar43._16_16_);
          H[lVar23 * 0x19 + uVar32 * 5 + 4] = auVar53._0_8_;
          lVar13 = lVar13 + 2;
          uVar33 = uVar32;
        }
        lVar23 = lVar23 + 5;
        lVar13 = CONCAT71(uVar82,uVar81) + 2;
        uVar81 = (undefined1)lVar13;
        uVar82 = (undefined7)((ulong)lVar13 >> 8);
        lVar13 = local_1c0._0_8_ + 1;
      }
      lVar23 = 2;
      uVar81 = 2;
      uVar82 = 0;
      for (uVar32 = 0; uVar32 != 5; uVar32 = uVar32 + 1) {
        local_1c0._0_8_ = lVar23;
        piVar16 = dgd_avg + (byte)(((ushort)lVar23 & 0xff) / 5);
        src_avg = piVar16 + (int)(dst_stride * 2);
        local_240._0_16_ = ZEXT816(0);
        local_240 = ZEXT1632(local_240._0_16_);
        local_260._0_16_ = ZEXT816(0);
        local_260 = ZEXT1632(local_260._0_16_);
        local_280._0_16_ = ZEXT816(0);
        local_280 = ZEXT1632(local_280._0_16_);
        local_2a0._0_16_ = ZEXT816(0);
        local_2a0 = ZEXT1632(local_2a0._0_16_);
        local_2c0._0_16_ = ZEXT816(0);
        local_2c0 = ZEXT1632(local_2c0._0_16_);
        piVar29 = (int64_t *)src_avg;
        iVar31 = v_start;
        iVar22 = iVar37;
        do {
          iVar34 = v_end - iVar31;
          if (3 < v_end - iVar31) {
            iVar34 = iVar22;
          }
          if (use_downsampled_wiener_stats == 0) {
            iVar34 = iVar22;
          }
          iVar22 = iVar34;
          auVar59._0_2_ = (undefined2)iVar22;
          auVar59._2_2_ = auVar59._0_2_;
          auVar59._4_2_ = auVar59._0_2_;
          auVar59._6_2_ = auVar59._0_2_;
          auVar59._8_2_ = auVar59._0_2_;
          auVar59._10_2_ = auVar59._0_2_;
          auVar59._12_2_ = auVar59._0_2_;
          auVar59._14_2_ = auVar59._0_2_;
          auVar59._16_2_ = auVar59._0_2_;
          auVar59._18_2_ = auVar59._0_2_;
          auVar59._20_2_ = auVar59._0_2_;
          auVar59._22_2_ = auVar59._0_2_;
          auVar59._24_2_ = auVar59._0_2_;
          auVar59._26_2_ = auVar59._0_2_;
          auVar59._28_2_ = auVar59._0_2_;
          auVar59._30_2_ = auVar59._0_2_;
          pauVar14 = (undefined1 (*) [32])(piVar16 + (int)(dst_stride * 2));
          for (uVar24 = 0; (long)uVar24 < lVar28; uVar24 = uVar24 + 0x10) {
            auVar43 = vpmullw_avx2(auVar59,*(undefined1 (*) [32])((long)piVar29 + uVar24 * 2));
            pauVar20 = pauVar14;
            for (lVar13 = 0; lVar13 != 0x60; lVar13 = lVar13 + 0x20) {
              auVar46 = vpmaddwd_avx2(auVar43,*pauVar20);
              auVar46 = vpaddd_avx2(auVar46,*(undefined1 (*) [32])(local_2c0 + lVar13));
              *(undefined1 (*) [32])(local_2c0 + lVar13) = auVar46;
              pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar35);
            }
            pauVar14 = pauVar14 + 1;
          }
          if (uVar18 != 0) {
            auVar43 = vpand_avx2(auVar47,*(undefined1 (*) [32])
                                          ((long)piVar29 + (uVar24 & 0xffffffff) * 2));
            auVar43 = vpmullw_avx2(auVar59,auVar43);
            for (lVar13 = 0; lVar13 != 0x60; lVar13 = lVar13 + 0x20) {
              auVar46 = vpmaddwd_avx2(auVar43,*pauVar14);
              auVar46 = vpaddd_avx2(auVar46,*(undefined1 (*) [32])(local_2c0 + lVar13));
              *(undefined1 (*) [32])(local_2c0 + lVar13) = auVar46;
              pauVar14 = (undefined1 (*) [32])(*pauVar14 + lVar35);
            }
          }
          iVar31 = iVar31 + iVar22;
          piVar16 = piVar16 + (int)(iVar22 * dst_stride);
          piVar29 = (int64_t *)((long)piVar29 + (long)(int)(iVar22 * dst_stride) * 2);
        } while (iVar31 < v_end);
        auVar43 = vphaddd_avx2(local_2c0,local_2a0);
        auVar46 = vphaddd_avx2(local_280,local_260);
        auVar43 = vphaddd_avx2(auVar43,auVar46);
        auVar46 = vpmovsxdq_avx2(auVar43._0_16_);
        auVar43 = vpmovsxdq_avx2(auVar43._16_16_);
        auVar43 = vpaddq_avx2(auVar46,auVar43);
        *(undefined1 (*) [32])(H + lVar23 * 0x1a) = auVar43;
        lVar13 = CONCAT71(uVar82,uVar81);
        uVar24 = uVar32;
        while (uVar24 < 4) {
          uVar24 = uVar24 + 1;
          local_240._0_16_ = ZEXT816(0);
          local_240 = ZEXT1632(local_240._0_16_);
          local_260._0_16_ = ZEXT816(0);
          local_260 = ZEXT1632(local_260._0_16_);
          local_280._0_16_ = ZEXT816(0);
          local_280 = ZEXT1632(local_280._0_16_);
          local_2a0._0_16_ = ZEXT816(0);
          local_2a0 = ZEXT1632(local_2a0._0_16_);
          local_2c0._0_16_ = ZEXT816(0);
          local_2c0 = ZEXT1632(local_2c0._0_16_);
          piVar29 = (int64_t *)src_avg;
          piVar16 = dgd_avg;
          iVar31 = v_start;
          iVar22 = iVar37;
          do {
            iVar34 = v_end - iVar31;
            if (3 < v_end - iVar31) {
              iVar34 = iVar22;
            }
            if (use_downsampled_wiener_stats == 0) {
              iVar34 = iVar22;
            }
            iVar22 = iVar34;
            auVar60._0_2_ = (undefined2)iVar22;
            auVar60._2_2_ = auVar60._0_2_;
            auVar60._4_2_ = auVar60._0_2_;
            auVar60._6_2_ = auVar60._0_2_;
            auVar60._8_2_ = auVar60._0_2_;
            auVar60._10_2_ = auVar60._0_2_;
            auVar60._12_2_ = auVar60._0_2_;
            auVar60._14_2_ = auVar60._0_2_;
            auVar60._16_2_ = auVar60._0_2_;
            auVar60._18_2_ = auVar60._0_2_;
            auVar60._20_2_ = auVar60._0_2_;
            auVar60._22_2_ = auVar60._0_2_;
            auVar60._24_2_ = auVar60._0_2_;
            auVar60._26_2_ = auVar60._0_2_;
            auVar60._28_2_ = auVar60._0_2_;
            auVar60._30_2_ = auVar60._0_2_;
            pauVar14 = (undefined1 (*) [32])((long)piVar16 + lVar13);
            for (uVar33 = 0; (long)uVar33 < lVar28; uVar33 = uVar33 + 0x10) {
              auVar43 = vpmullw_avx2(auVar60,*(undefined1 (*) [32])((long)piVar29 + uVar33 * 2));
              pauVar20 = pauVar14;
              for (lVar41 = 0; lVar41 != 0xa0; lVar41 = lVar41 + 0x20) {
                auVar46 = vpmaddwd_avx2(auVar43,*pauVar20);
                auVar46 = vpaddd_avx2(auVar46,*(undefined1 (*) [32])(local_2c0 + lVar41));
                *(undefined1 (*) [32])(local_2c0 + lVar41) = auVar46;
                pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar35);
              }
              pauVar14 = pauVar14 + 1;
            }
            if (uVar18 != 0) {
              auVar43 = vpand_avx2(auVar47,*(undefined1 (*) [32])
                                            ((long)piVar29 + (uVar33 & 0xffffffff) * 2));
              auVar43 = vpmullw_avx2(auVar60,auVar43);
              for (lVar41 = 0; lVar41 != 0xa0; lVar41 = lVar41 + 0x20) {
                auVar46 = vpmaddwd_avx2(auVar43,*pauVar14);
                auVar46 = vpaddd_avx2(auVar46,*(undefined1 (*) [32])(local_2c0 + lVar41));
                *(undefined1 (*) [32])(local_2c0 + lVar41) = auVar46;
                pauVar14 = (undefined1 (*) [32])(*pauVar14 + lVar35);
              }
            }
            iVar31 = iVar31 + iVar22;
            piVar16 = piVar16 + (int)(iVar22 * dst_stride);
            piVar29 = (int64_t *)((long)piVar29 + (long)(int)(iVar22 * dst_stride) * 2);
          } while (iVar31 < v_end);
          auVar43 = vphaddd_avx2(local_2c0,local_2a0);
          auVar46 = vphaddd_avx2(local_280,local_260);
          auVar43 = vphaddd_avx2(auVar43,auVar46);
          auVar46 = vpmovsxdq_avx2(auVar43._0_16_);
          auVar43 = vpmovsxdq_avx2(auVar43._16_16_);
          auVar43 = vpaddq_avx2(auVar46,auVar43);
          *(undefined1 (*) [32])(H + lVar23 * 0x19 + uVar24 * 5) = auVar43;
          auVar43 = vpmovsxdq_avx2(local_240._0_16_);
          auVar46 = vpmovsxdq_avx2(local_240._16_16_);
          auVar43 = vpaddq_avx2(auVar43,auVar46);
          auVar46 = vpshufd_avx2(auVar43,0x44);
          auVar43 = vpshufd_avx2(auVar43,0xee);
          auVar43 = vpaddq_avx2(auVar46,auVar43);
          auVar53 = vpaddq_avx(auVar43._0_16_,auVar43._16_16_);
          H[lVar23 * 0x19 + uVar24 * 5 + 4] = auVar53._0_8_;
          lVar13 = lVar13 + 2;
          uVar33 = uVar24;
        }
        lVar23 = lVar23 + 5;
        lVar13 = CONCAT71(uVar82,uVar81) + 2;
        uVar81 = (undefined1)lVar13;
        uVar82 = (undefined7)((ulong)lVar13 >> 8);
      }
      iVar31 = dst_stride * 3;
      lVar13 = (long)iVar31;
      lVar23 = 3;
      local_1c0._0_8_ = 2;
      uVar81 = (undefined1)iVar31;
      iVar83 = (int7)(int3)((uint)iVar31 >> 8);
      lVar41 = 0;
      while (lVar41 != 5) {
        uVar74 = (undefined4)lVar41;
        uVar73 = (undefined4)((ulong)lVar41 >> 0x20);
        uVar75 = (undefined4)lVar23;
        uVar76 = (undefined4)((ulong)lVar23 >> 0x20);
        piVar16 = dgd_avg + (byte)(((ushort)lVar23 & 0xff) / 5);
        piVar25 = piVar16 + lVar13;
        local_240._0_16_ = ZEXT816(0);
        local_240 = ZEXT1632(local_240._0_16_);
        local_260._0_16_ = ZEXT816(0);
        local_260 = ZEXT1632(local_260._0_16_);
        local_280._0_16_ = ZEXT816(0);
        local_280 = ZEXT1632(local_280._0_16_);
        local_2a0._0_16_ = ZEXT816(0);
        local_2a0 = ZEXT1632(local_2a0._0_16_);
        local_2c0._0_16_ = ZEXT816(0);
        local_2c0 = ZEXT1632(local_2c0._0_16_);
        piVar15 = piVar25;
        iVar31 = v_start;
        iVar22 = iVar37;
        do {
          iVar34 = v_end - iVar31;
          if (3 < v_end - iVar31) {
            iVar34 = iVar22;
          }
          if (use_downsampled_wiener_stats == 0) {
            iVar34 = iVar22;
          }
          iVar22 = iVar34;
          auVar47._0_2_ = (undefined2)iVar22;
          auVar47._2_2_ = auVar47._0_2_;
          auVar47._4_2_ = auVar47._0_2_;
          auVar47._6_2_ = auVar47._0_2_;
          auVar47._8_2_ = auVar47._0_2_;
          auVar47._10_2_ = auVar47._0_2_;
          auVar47._12_2_ = auVar47._0_2_;
          auVar47._14_2_ = auVar47._0_2_;
          auVar47._16_2_ = auVar47._0_2_;
          auVar47._18_2_ = auVar47._0_2_;
          auVar47._20_2_ = auVar47._0_2_;
          auVar47._22_2_ = auVar47._0_2_;
          auVar47._24_2_ = auVar47._0_2_;
          auVar47._26_2_ = auVar47._0_2_;
          auVar47._28_2_ = auVar47._0_2_;
          auVar47._30_2_ = auVar47._0_2_;
          pauVar14 = (undefined1 (*) [32])(piVar16 + lVar13);
          uVar32 = 0;
          while( true ) {
            if (lVar28 <= (long)uVar32) break;
            auVar43 = vpmullw_avx2(auVar47,*(undefined1 (*) [32])(piVar15 + uVar32));
            pauVar20 = pauVar14;
            for (lVar23 = 0; lVar23 != 0x40; lVar23 = lVar23 + 0x20) {
              auVar46 = vpmaddwd_avx2(auVar43,*pauVar20);
              auVar46 = vpaddd_avx2(auVar46,*(undefined1 (*) [32])(local_2c0 + lVar23));
              *(undefined1 (*) [32])(local_2c0 + lVar23) = auVar46;
              pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar35);
            }
            uVar32 = uVar32 + 0x10;
            pauVar14 = pauVar14 + 1;
          }
          if (uVar18 != 0) {
            auVar43 = vpand_avx2(auVar71._0_32_,
                                 *(undefined1 (*) [32])(piVar15 + (uVar32 & 0xffffffff)));
            auVar43 = vpmullw_avx2(auVar47,auVar43);
            for (lVar23 = 0; lVar23 != 0x40; lVar23 = lVar23 + 0x20) {
              auVar46 = vpmaddwd_avx2(auVar43,*pauVar14);
              auVar46 = vpaddd_avx2(auVar46,*(undefined1 (*) [32])(local_2c0 + lVar23));
              *(undefined1 (*) [32])(local_2c0 + lVar23) = auVar46;
              pauVar14 = (undefined1 (*) [32])(*pauVar14 + lVar35);
            }
          }
          iVar31 = iVar31 + iVar22;
          piVar16 = piVar16 + (int)(iVar22 * dst_stride);
          piVar15 = piVar15 + (int)(iVar22 * dst_stride);
        } while (iVar31 < v_end);
        src0_01[1]._0_4_ = (int)piVar25;
        src0_01[0] = lVar41;
        src0_01[1]._4_4_ = (int)((ulong)piVar25 >> 0x20);
        src0_01[2]._0_4_ = uVar75;
        src0_01[2]._4_4_ = uVar76;
        src0_01[3] = (longlong)src_avg;
        src1_01[1]._0_4_ = iVar37;
        src1_01[0] = uVar33;
        src1_01[1]._4_4_ = uVar79;
        src1_01[2] = (longlong)dgd_avg;
        src1_01[3]._0_1_ = uVar81;
        src1_01[3]._1_7_ = iVar83;
        iVar42 = local_2c0._0_8_;
        iVar52 = local_2c0._8_8_;
        convert_32_to_64_add_avx2(src0_01,src1_01);
        auVar71 = ZEXT3264(local_180);
        src_avg = (int16_t *)(H + CONCAT44(uVar76,uVar75) * 0x19);
        *(int64_t *)((long)src_avg + CONCAT44(uVar76,uVar75) * 8) = iVar42;
        ((int64_t *)((long)src_avg + CONCAT44(uVar76,uVar75) * 8))[1] = iVar52;
        uVar32 = CONCAT44(uVar73,uVar74);
        lVar23 = local_1c0._0_8_;
        while (uVar32 < 4) {
          uVar32 = uVar32 + 1;
          local_240._0_16_ = ZEXT816(0);
          local_240 = ZEXT1632(local_240._0_16_);
          local_260._0_16_ = ZEXT816(0);
          local_260 = ZEXT1632(local_260._0_16_);
          local_280._0_16_ = ZEXT816(0);
          local_280 = ZEXT1632(local_280._0_16_);
          local_2a0._0_16_ = ZEXT816(0);
          local_2a0 = ZEXT1632(local_2a0._0_16_);
          local_2c0._0_16_ = ZEXT816(0);
          local_2c0 = ZEXT1632(local_2c0._0_16_);
          piVar15 = piVar25;
          piVar16 = dgd_avg;
          iVar31 = v_start;
          iVar22 = iVar37;
          do {
            iVar34 = v_end - iVar31;
            if (3 < v_end - iVar31) {
              iVar34 = iVar22;
            }
            if (use_downsampled_wiener_stats == 0) {
              iVar34 = iVar22;
            }
            iVar22 = iVar34;
            auVar48._0_2_ = (undefined2)iVar22;
            auVar48._2_2_ = auVar48._0_2_;
            auVar48._4_2_ = auVar48._0_2_;
            auVar48._6_2_ = auVar48._0_2_;
            auVar48._8_2_ = auVar48._0_2_;
            auVar48._10_2_ = auVar48._0_2_;
            auVar48._12_2_ = auVar48._0_2_;
            auVar48._14_2_ = auVar48._0_2_;
            auVar48._16_2_ = auVar48._0_2_;
            auVar48._18_2_ = auVar48._0_2_;
            auVar48._20_2_ = auVar48._0_2_;
            auVar48._22_2_ = auVar48._0_2_;
            auVar48._24_2_ = auVar48._0_2_;
            auVar48._26_2_ = auVar48._0_2_;
            auVar48._28_2_ = auVar48._0_2_;
            auVar48._30_2_ = auVar48._0_2_;
            pauVar14 = (undefined1 (*) [32])((long)piVar16 + lVar23);
            for (uVar33 = 0; (long)uVar33 < lVar28; uVar33 = uVar33 + 0x10) {
              auVar43 = vpmullw_avx2(auVar48,*(undefined1 (*) [32])(piVar15 + uVar33));
              pauVar20 = pauVar14;
              for (lVar13 = 0; lVar13 != 0xa0; lVar13 = lVar13 + 0x20) {
                auVar46 = vpmaddwd_avx2(auVar43,*pauVar20);
                auVar46 = vpaddd_avx2(auVar46,*(undefined1 (*) [32])(local_2c0 + lVar13));
                *(undefined1 (*) [32])(local_2c0 + lVar13) = auVar46;
                pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar35);
              }
              pauVar14 = pauVar14 + 1;
            }
            if (uVar18 != 0) {
              auVar43 = vpand_avx2(local_180,*(undefined1 (*) [32])(piVar15 + (uVar33 & 0xffffffff))
                                  );
              auVar43 = vpmullw_avx2(auVar48,auVar43);
              for (lVar13 = 0; lVar13 != 0xa0; lVar13 = lVar13 + 0x20) {
                auVar46 = vpmaddwd_avx2(auVar43,*pauVar14);
                auVar46 = vpaddd_avx2(auVar46,*(undefined1 (*) [32])(local_2c0 + lVar13));
                *(undefined1 (*) [32])(local_2c0 + lVar13) = auVar46;
                pauVar14 = (undefined1 (*) [32])(*pauVar14 + lVar35);
              }
            }
            iVar31 = iVar31 + iVar22;
            piVar16 = piVar16 + (int)(iVar22 * dst_stride);
            piVar15 = piVar15 + (int)(iVar22 * dst_stride);
          } while (iVar31 < v_end);
          auVar43 = vphaddd_avx2(local_2c0,local_2a0);
          auVar46 = vphaddd_avx2(local_280,local_260);
          auVar43 = vphaddd_avx2(auVar43,auVar46);
          auVar46 = vpmovsxdq_avx2(auVar43._0_16_);
          auVar43 = vpmovsxdq_avx2(auVar43._16_16_);
          auVar43 = vpaddq_avx2(auVar46,auVar43);
          *(undefined1 (*) [32])((long)src_avg + uVar32 * 5 * 8) = auVar43;
          auVar43 = vpmovsxdq_avx2(local_240._0_16_);
          auVar46 = vpmovsxdq_avx2(local_240._16_16_);
          auVar43 = vpaddq_avx2(auVar43,auVar46);
          auVar46 = vpshufd_avx2(auVar43,0x44);
          auVar43 = vpshufd_avx2(auVar43,0xee);
          auVar43 = vpaddq_avx2(auVar46,auVar43);
          auVar53 = vpaddq_avx(auVar43._0_16_,auVar43._16_16_);
          *(int64_t *)((long)src_avg + (uVar32 * 5 + 4) * 8) = auVar53._0_8_;
          lVar23 = lVar23 + 2;
          uVar33 = uVar32;
        }
        lVar23 = CONCAT44(uVar76,uVar75) + 5;
        local_1c0._0_8_ = local_1c0._0_8_ + 2;
        lVar13 = CONCAT71(iVar83,uVar81);
        lVar41 = CONCAT44(uVar73,uVar74) + 1;
      }
      iVar31 = dst_stride * 4;
      lVar13 = (long)iVar31;
      lVar23 = 4;
      local_1c0._0_8_ = 2;
      uVar81 = (undefined1)iVar31;
      iVar83 = (int7)(int3)((uint)iVar31 >> 8);
      lVar41 = 0;
      while (lVar41 != 5) {
        uVar74 = (undefined4)lVar41;
        uVar73 = (undefined4)((ulong)lVar41 >> 0x20);
        uVar75 = (undefined4)lVar23;
        uVar76 = (undefined4)((ulong)lVar23 >> 0x20);
        piVar16 = dgd_avg + (byte)(((ushort)lVar23 & 0xff) / 5);
        piVar25 = piVar16 + lVar13;
        auVar51 = ZEXT1664((undefined1  [16])0x0);
        piVar15 = piVar25;
        iVar31 = v_start;
        iVar22 = iVar37;
        do {
          iVar34 = v_end - iVar31;
          if (3 < v_end - iVar31) {
            iVar34 = iVar22;
          }
          if (use_downsampled_wiener_stats == 0) {
            iVar34 = iVar22;
          }
          iVar22 = iVar34;
          auVar65._0_2_ = (undefined2)iVar22;
          auVar65._2_2_ = auVar65._0_2_;
          auVar65._4_2_ = auVar65._0_2_;
          auVar65._6_2_ = auVar65._0_2_;
          auVar65._8_2_ = auVar65._0_2_;
          auVar65._10_2_ = auVar65._0_2_;
          auVar65._12_2_ = auVar65._0_2_;
          auVar65._14_2_ = auVar65._0_2_;
          auVar65._16_2_ = auVar65._0_2_;
          auVar65._18_2_ = auVar65._0_2_;
          auVar65._20_2_ = auVar65._0_2_;
          auVar65._22_2_ = auVar65._0_2_;
          auVar65._24_2_ = auVar65._0_2_;
          auVar65._26_2_ = auVar65._0_2_;
          auVar65._28_2_ = auVar65._0_2_;
          auVar65._30_2_ = auVar65._0_2_;
          for (lVar23 = 0; lVar23 < lVar28; lVar23 = lVar23 + 0x10) {
            auVar43 = vpmullw_avx2(auVar65,*(undefined1 (*) [32])(piVar15 + lVar23));
            auVar43 = vpmaddwd_avx2(auVar43,*(undefined1 (*) [32])(piVar16 + lVar13 + lVar23));
            auVar43 = vpaddd_avx2(auVar43,auVar51._0_32_);
            auVar51 = ZEXT3264(auVar43);
          }
          if (uVar18 != 0) {
            auVar43 = vpand_avx2(auVar71._0_32_,*(undefined1 (*) [32])(piVar15 + lVar23));
            auVar43 = vpmullw_avx2(auVar65,auVar43);
            auVar43 = vpmaddwd_avx2(auVar43,*(undefined1 (*) [32])(piVar16 + lVar13 + lVar23));
            auVar43 = vpaddd_avx2(auVar43,auVar51._0_32_);
            auVar51 = ZEXT3264(auVar43);
          }
          auVar53 = auVar51._0_16_;
          iVar31 = iVar31 + iVar22;
          piVar16 = piVar16 + (int)(iVar22 * dst_stride);
          piVar15 = piVar15 + (int)(iVar22 * dst_stride);
        } while (iVar31 < v_end);
        src0_02[1]._0_4_ = (int)piVar25;
        src0_02[0] = lVar41;
        src0_02[1]._4_4_ = (int)((ulong)piVar25 >> 0x20);
        src0_02[2]._0_4_ = uVar75;
        src0_02[2]._4_4_ = uVar76;
        src0_02[3] = (longlong)src_avg;
        src1_02[1]._0_4_ = iVar37;
        src1_02[0] = uVar33;
        src1_02[1]._4_4_ = uVar79;
        src1_02[2] = (longlong)dgd_avg;
        src1_02[3]._0_1_ = uVar81;
        src1_02[3]._1_7_ = iVar83;
        convert_32_to_64_add_avx2(src0_02,src1_02);
        auVar71 = ZEXT3264(local_180);
        src_avg = (int16_t *)(H + CONCAT44(uVar76,uVar75) * 0x19);
        *(undefined1 (*) [16])((long)src_avg + CONCAT44(uVar76,uVar75) * 8) = auVar53;
        uVar32 = CONCAT44(uVar73,uVar74);
        lVar23 = local_1c0._0_8_;
        while (uVar32 < 4) {
          uVar32 = uVar32 + 1;
          local_240._0_16_ = ZEXT816(0);
          local_240 = ZEXT1632(local_240._0_16_);
          local_260._0_16_ = ZEXT816(0);
          local_260 = ZEXT1632(local_260._0_16_);
          local_280._0_16_ = ZEXT816(0);
          local_280 = ZEXT1632(local_280._0_16_);
          local_2a0._0_16_ = ZEXT816(0);
          local_2a0 = ZEXT1632(local_2a0._0_16_);
          local_2c0._0_16_ = ZEXT816(0);
          local_2c0 = ZEXT1632(local_2c0._0_16_);
          piVar16 = dgd_avg;
          piVar15 = piVar25;
          iVar31 = v_start;
          iVar22 = iVar37;
          do {
            iVar34 = v_end - iVar31;
            if (3 < v_end - iVar31) {
              iVar34 = iVar22;
            }
            if (use_downsampled_wiener_stats == 0) {
              iVar34 = iVar22;
            }
            iVar22 = iVar34;
            auVar49._0_2_ = (undefined2)iVar22;
            auVar49._2_2_ = auVar49._0_2_;
            auVar49._4_2_ = auVar49._0_2_;
            auVar49._6_2_ = auVar49._0_2_;
            auVar49._8_2_ = auVar49._0_2_;
            auVar49._10_2_ = auVar49._0_2_;
            auVar49._12_2_ = auVar49._0_2_;
            auVar49._14_2_ = auVar49._0_2_;
            auVar49._16_2_ = auVar49._0_2_;
            auVar49._18_2_ = auVar49._0_2_;
            auVar49._20_2_ = auVar49._0_2_;
            auVar49._22_2_ = auVar49._0_2_;
            auVar49._24_2_ = auVar49._0_2_;
            auVar49._26_2_ = auVar49._0_2_;
            auVar49._28_2_ = auVar49._0_2_;
            auVar49._30_2_ = auVar49._0_2_;
            pauVar14 = (undefined1 (*) [32])((long)piVar16 + lVar23);
            for (uVar33 = 0; (long)uVar33 < lVar28; uVar33 = uVar33 + 0x10) {
              auVar43 = vpmullw_avx2(auVar49,*(undefined1 (*) [32])(piVar15 + uVar33));
              pauVar20 = pauVar14;
              for (lVar13 = 0; lVar13 != 0xa0; lVar13 = lVar13 + 0x20) {
                auVar46 = vpmaddwd_avx2(auVar43,*pauVar20);
                auVar46 = vpaddd_avx2(auVar46,*(undefined1 (*) [32])(local_2c0 + lVar13));
                *(undefined1 (*) [32])(local_2c0 + lVar13) = auVar46;
                pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar35);
              }
              pauVar14 = pauVar14 + 1;
            }
            if (uVar18 != 0) {
              auVar43 = vpand_avx2(local_180,*(undefined1 (*) [32])(piVar15 + (uVar33 & 0xffffffff))
                                  );
              auVar43 = vpmullw_avx2(auVar49,auVar43);
              for (lVar13 = 0; lVar13 != 0xa0; lVar13 = lVar13 + 0x20) {
                auVar46 = vpmaddwd_avx2(auVar43,*pauVar14);
                auVar46 = vpaddd_avx2(auVar46,*(undefined1 (*) [32])(local_2c0 + lVar13));
                *(undefined1 (*) [32])(local_2c0 + lVar13) = auVar46;
                pauVar14 = (undefined1 (*) [32])(*pauVar14 + lVar35);
              }
            }
            iVar31 = iVar31 + iVar22;
            piVar16 = piVar16 + (int)(iVar22 * dst_stride);
            piVar15 = piVar15 + (int)(iVar22 * dst_stride);
          } while (iVar31 < v_end);
          auVar43 = vphaddd_avx2(local_2c0,local_2a0);
          auVar46 = vphaddd_avx2(local_280,local_260);
          auVar43 = vphaddd_avx2(auVar43,auVar46);
          auVar46 = vpmovsxdq_avx2(auVar43._0_16_);
          auVar43 = vpmovsxdq_avx2(auVar43._16_16_);
          auVar43 = vpaddq_avx2(auVar46,auVar43);
          *(undefined1 (*) [32])((long)src_avg + uVar32 * 5 * 8) = auVar43;
          auVar43 = vpmovsxdq_avx2(local_240._0_16_);
          auVar46 = vpmovsxdq_avx2(local_240._16_16_);
          auVar43 = vpaddq_avx2(auVar43,auVar46);
          auVar46 = vpshufd_avx2(auVar43,0x44);
          auVar43 = vpshufd_avx2(auVar43,0xee);
          auVar43 = vpaddq_avx2(auVar46,auVar43);
          auVar53 = vpaddq_avx(auVar43._0_16_,auVar43._16_16_);
          *(int64_t *)((long)src_avg + (uVar32 * 5 + 4) * 8) = auVar53._0_8_;
          lVar23 = lVar23 + 2;
          uVar33 = uVar32;
        }
        lVar23 = CONCAT44(uVar76,uVar75) + 5;
        local_1c0._0_8_ = local_1c0._0_8_ + 2;
        lVar13 = CONCAT71(iVar83,uVar81);
        lVar41 = CONCAT44(uVar73,uVar74) + 1;
      }
      lVar41 = 5;
      lVar23 = 4;
      for (lVar13 = 1; lVar13 != 5; lVar13 = lVar13 + 1) {
        lVar36 = 0;
        local_1c0._0_8_ = lVar13;
        lVar17 = 0;
        lVar19 = lVar13;
        do {
          local_240._0_16_ = ZEXT816(0);
          local_240 = ZEXT1632(local_240._0_16_);
          local_260._0_16_ = ZEXT816(0);
          local_260 = ZEXT1632(local_260._0_16_);
          local_280._0_16_ = ZEXT816(0);
          local_280 = ZEXT1632(local_280._0_16_);
          local_2a0._0_16_ = ZEXT816(0);
          local_2a0 = ZEXT1632(local_2a0._0_16_);
          local_2c0._0_16_ = ZEXT816(0);
          local_2c0 = ZEXT1632(local_2c0._0_16_);
          piVar16 = dgd_avg + (byte)(((ushort)lVar41 & 0xff) / 5);
          piVar25 = dgd_avg + (byte)(((ushort)lVar41 & 0xff) / 5);
          iVar31 = v_start;
          iVar22 = iVar37;
          do {
            iVar34 = v_end - iVar31;
            if (3 < v_end - iVar31) {
              iVar34 = iVar22;
            }
            if (use_downsampled_wiener_stats == 0) {
              iVar34 = iVar22;
            }
            iVar22 = iVar34;
            auVar68._0_2_ = (undefined2)iVar22;
            auVar68._2_2_ = auVar68._0_2_;
            auVar68._4_2_ = auVar68._0_2_;
            auVar68._6_2_ = auVar68._0_2_;
            auVar68._8_2_ = auVar68._0_2_;
            auVar68._10_2_ = auVar68._0_2_;
            auVar68._12_2_ = auVar68._0_2_;
            auVar68._14_2_ = auVar68._0_2_;
            auVar68._16_2_ = auVar68._0_2_;
            auVar68._18_2_ = auVar68._0_2_;
            auVar68._20_2_ = auVar68._0_2_;
            auVar68._22_2_ = auVar68._0_2_;
            auVar68._24_2_ = auVar68._0_2_;
            auVar68._26_2_ = auVar68._0_2_;
            auVar68._28_2_ = auVar68._0_2_;
            auVar68._30_2_ = auVar68._0_2_;
            pauVar14 = (undefined1 (*) [32])((long)piVar16 + lVar36);
            for (uVar33 = 0; (long)uVar33 < lVar28; uVar33 = uVar33 + 0x10) {
              auVar43 = vpmullw_avx2(auVar68,*(undefined1 (*) [32])(piVar25 + uVar33));
              pauVar20 = pauVar14;
              for (lVar26 = 0; lVar26 != 0xa0; lVar26 = lVar26 + 0x20) {
                auVar46 = vpmaddwd_avx2(auVar43,*pauVar20);
                auVar46 = vpaddd_avx2(auVar46,*(undefined1 (*) [32])(local_2c0 + lVar26));
                *(undefined1 (*) [32])(local_2c0 + lVar26) = auVar46;
                pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar35);
              }
              pauVar14 = pauVar14 + 1;
            }
            if (uVar18 != 0) {
              auVar43 = vpand_avx2(auVar71._0_32_,
                                   *(undefined1 (*) [32])(piVar25 + (uVar33 & 0xffffffff)));
              auVar43 = vpmullw_avx2(auVar68,auVar43);
              for (lVar26 = 0; lVar26 != 0xa0; lVar26 = lVar26 + 0x20) {
                auVar46 = vpmaddwd_avx2(auVar43,*pauVar14);
                auVar46 = vpaddd_avx2(auVar46,*(undefined1 (*) [32])(local_2c0 + lVar26));
                *(undefined1 (*) [32])(local_2c0 + lVar26) = auVar46;
                pauVar14 = (undefined1 (*) [32])(*pauVar14 + lVar35);
              }
            }
            iVar31 = iVar31 + iVar22;
            piVar16 = piVar16 + (int)(iVar22 * dst_stride);
            piVar25 = piVar25 + (int)(iVar22 * dst_stride);
          } while (iVar31 < v_end);
          auVar43 = vphaddd_avx2(local_2c0,local_2a0);
          auVar46 = vphaddd_avx2(local_280,local_260);
          auVar43 = vphaddd_avx2(auVar43,auVar46);
          auVar46 = vpmovsxdq_avx2(auVar43._0_16_);
          auVar43 = vpmovsxdq_avx2(auVar43._16_16_);
          auVar43 = vpaddq_avx2(auVar46,auVar43);
          *(undefined1 (*) [32])(H + lVar41 * 0x19 + lVar19 * 5) = auVar43;
          auVar43 = vpmovsxdq_avx2(local_240._0_16_);
          auVar46 = vpmovsxdq_avx2(local_240._16_16_);
          auVar43 = vpaddq_avx2(auVar43,auVar46);
          auVar46 = vpshufd_avx2(auVar43,0x44);
          auVar43 = vpshufd_avx2(auVar43,0xee);
          auVar43 = vpaddq_avx2(auVar46,auVar43);
          auVar53 = vpaddq_avx(auVar43._0_16_,auVar43._16_16_);
          H[lVar41 * 0x19 + lVar19 * 5 + 4] = auVar53._0_8_;
          lVar17 = lVar17 + 1;
          lVar19 = lVar19 + 1;
          lVar36 = lVar36 + 2;
        } while (lVar17 != lVar23);
        lVar41 = lVar41 + 5;
        lVar23 = lVar23 + -1;
      }
      wiener_win2 = 0x19;
    }
    else {
      if (wiener_win != 7) {
        return;
      }
      lVar35 = 1;
      local_188 = 2;
      bVar80 = 3;
      uVar82 = 0;
      local_1c0._0_8_ = 4;
      local_180._0_8_ = 5;
      uVar18 = uVar39 & 0xf;
      auVar43 = *(undefined1 (*) [32])(mask_16bit + (0x10 - uVar18));
      iVar37 = (uint)(use_downsampled_wiener_stats != 0) * 3 + 1;
      lVar41 = (long)(int)(uVar39 & 0xfffffff0);
      lVar23 = ((long)(int)uVar38 & 0xfffffffffffffff0U) * 2;
      lVar13 = 0;
      lVar28 = 0;
      do {
        local_200._0_16_ = ZEXT816(0);
        local_200 = ZEXT1632(local_200._0_16_);
        local_220._0_16_ = ZEXT816(0);
        local_220 = ZEXT1632(local_220._0_16_);
        local_240._0_16_ = ZEXT816(0);
        local_240 = ZEXT1632(local_240._0_16_);
        local_260._0_16_ = ZEXT816(0);
        local_260 = ZEXT1632(local_260._0_16_);
        local_280._0_16_ = ZEXT816(0);
        local_280 = ZEXT1632(local_280._0_16_);
        local_2a0._0_16_ = ZEXT816(0);
        local_2a0 = ZEXT1632(local_2a0._0_16_);
        local_2c0._0_16_ = ZEXT816(0);
        local_2c0 = ZEXT1632(local_2c0._0_16_);
        local_a0 = 0;
        uStack_98 = 0;
        uStack_90 = 0;
        uStack_88 = 0;
        local_c0 = 0;
        uStack_b8 = 0;
        uStack_b0 = 0;
        uStack_a8 = 0;
        local_e0 = 0;
        uStack_d8 = 0;
        uStack_d0 = 0;
        uStack_c8 = 0;
        local_100 = 0;
        uStack_f8 = 0;
        uStack_f0 = 0;
        uStack_e8 = 0;
        local_120 = 0;
        uStack_118 = 0;
        uStack_110 = 0;
        uStack_108 = 0;
        local_140 = 0;
        uStack_138 = 0;
        uStack_130 = 0;
        uStack_128 = 0;
        local_160 = 0;
        uStack_158 = 0;
        uStack_150 = 0;
        uStack_148 = 0;
        piVar16 = dgd_avg;
        piVar29 = (int64_t *)src_avg;
        iVar22 = v_start;
        iVar34 = iVar37;
        do {
          iVar30 = v_end - iVar22;
          if (3 < v_end - iVar22) {
            iVar30 = iVar34;
          }
          if (use_downsampled_wiener_stats == 0) {
            iVar30 = iVar34;
          }
          iVar34 = iVar30;
          auVar54._0_2_ = (undefined2)iVar34;
          auVar54._2_2_ = auVar54._0_2_;
          auVar54._4_2_ = auVar54._0_2_;
          auVar54._6_2_ = auVar54._0_2_;
          auVar54._8_2_ = auVar54._0_2_;
          auVar54._10_2_ = auVar54._0_2_;
          auVar54._12_2_ = auVar54._0_2_;
          auVar54._14_2_ = auVar54._0_2_;
          auVar54._16_2_ = auVar54._0_2_;
          auVar54._18_2_ = auVar54._0_2_;
          auVar54._20_2_ = auVar54._0_2_;
          auVar54._22_2_ = auVar54._0_2_;
          auVar54._24_2_ = auVar54._0_2_;
          auVar54._26_2_ = auVar54._0_2_;
          auVar54._28_2_ = auVar54._0_2_;
          auVar54._30_2_ = auVar54._0_2_;
          pauVar14 = (undefined1 (*) [32])((long)piVar16 + lVar13);
          for (uVar32 = 0; (long)uVar32 < lVar41; uVar32 = uVar32 + 0x10) {
            auVar46 = vpmullw_avx2(auVar54,*(undefined1 (*) [32])((long)piVar29 + uVar32 * 2));
            auVar50 = vpmullw_avx2(auVar54,*(undefined1 (*) [32])(piVar16 + uVar32));
            pauVar20 = pauVar14;
            for (lVar19 = 0; lVar19 != 0xe0; lVar19 = lVar19 + 0x20) {
              auVar2 = vpmaddwd_avx2(auVar46,*pauVar20);
              auVar2 = vpaddd_avx2(auVar2,*(undefined1 (*) [32])(local_2c0 + lVar19));
              auVar3 = vpmaddwd_avx2(auVar50,*pauVar20);
              auVar3 = vpaddd_avx2(auVar3,*(undefined1 (*) [32])((long)&local_160 + lVar19));
              *(undefined1 (*) [32])(local_2c0 + lVar19) = auVar2;
              *(undefined1 (*) [32])((long)&local_160 + lVar19) = auVar3;
              pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar23);
            }
            pauVar14 = pauVar14 + 1;
          }
          if (uVar18 != 0) {
            auVar46 = vpand_avx2(auVar43,*(undefined1 (*) [32])
                                          ((long)piVar29 + (uVar32 & 0xffffffff) * 2));
            auVar50 = vpand_avx2(auVar43,*(undefined1 (*) [32])(piVar16 + (uVar32 & 0xffffffff)));
            auVar46 = vpmullw_avx2(auVar54,auVar46);
            auVar50 = vpmullw_avx2(auVar54,auVar50);
            for (lVar19 = 0; lVar19 != 0xe0; lVar19 = lVar19 + 0x20) {
              auVar2 = vpmaddwd_avx2(auVar46,*pauVar14);
              auVar2 = vpaddd_avx2(auVar2,*(undefined1 (*) [32])(local_2c0 + lVar19));
              auVar3 = vpmaddwd_avx2(auVar50,*pauVar14);
              auVar3 = vpaddd_avx2(auVar3,*(undefined1 (*) [32])((long)&local_160 + lVar19));
              *(undefined1 (*) [32])(local_2c0 + lVar19) = auVar2;
              *(undefined1 (*) [32])((long)&local_160 + lVar19) = auVar3;
              pauVar14 = (undefined1 (*) [32])(*pauVar14 + lVar23);
            }
          }
          iVar22 = iVar22 + iVar34;
          piVar29 = (int64_t *)((long)piVar29 + (long)(int)(iVar34 * uVar21) * 2);
          piVar16 = piVar16 + (int)(iVar34 * dst_stride);
        } while (iVar22 < v_end);
        auVar46 = vphaddd_avx2(local_2c0,local_2a0);
        auVar50 = vphaddd_avx2(local_280,local_260);
        auVar46 = vphaddd_avx2(auVar46,auVar50);
        auVar2 = vpmovsxdq_avx2(auVar46._0_16_);
        auVar46 = vpmovsxdq_avx2(auVar46._16_16_);
        auVar50 = vphaddd_avx2(local_240,local_220);
        auVar46 = vpaddq_avx2(auVar2,auVar46);
        auVar2 = vphaddd_avx2(local_200,local_200);
        auVar50 = vphaddd_avx2(auVar50,auVar2);
        auVar2 = vpmovsxdq_avx2(auVar50._0_16_);
        auVar50 = vpmovsxdq_avx2(auVar50._16_16_);
        auVar50 = vpaddq_avx2(auVar2,auVar50);
        *(undefined1 (*) [32])(M + lVar28 * 7) = auVar46;
        *(undefined1 (*) [16])(M + lVar28 * 7 + 4) = auVar50._0_16_;
        M[lVar28 * 7 + 6] = auVar50._16_8_;
        auVar4._8_8_ = uStack_158;
        auVar4._0_8_ = local_160;
        auVar4._16_8_ = uStack_150;
        auVar4._24_8_ = uStack_148;
        auVar6._8_8_ = uStack_118;
        auVar6._0_8_ = local_120;
        auVar6._16_8_ = uStack_110;
        auVar6._24_8_ = uStack_108;
        auVar9._8_8_ = uStack_d8;
        auVar9._0_8_ = local_e0;
        auVar9._16_8_ = uStack_d0;
        auVar9._24_8_ = uStack_c8;
        auVar11._8_8_ = uStack_98;
        auVar11._0_8_ = local_a0;
        auVar11._16_8_ = uStack_90;
        auVar11._24_8_ = uStack_88;
        auVar5._8_8_ = uStack_138;
        auVar5._0_8_ = local_140;
        auVar5._16_8_ = uStack_130;
        auVar5._24_8_ = uStack_128;
        auVar46 = vphaddd_avx2(auVar4,auVar5);
        auVar7._8_8_ = uStack_f8;
        auVar7._0_8_ = local_100;
        auVar7._16_8_ = uStack_f0;
        auVar7._24_8_ = uStack_e8;
        auVar50 = vphaddd_avx2(auVar6,auVar7);
        auVar46 = vphaddd_avx2(auVar46,auVar50);
        auVar3 = vpmovsxdq_avx2(auVar46._0_16_);
        auVar10._8_8_ = uStack_b8;
        auVar10._0_8_ = local_c0;
        auVar10._16_8_ = uStack_b0;
        auVar10._24_8_ = uStack_a8;
        auVar50 = vphaddd_avx2(auVar9,auVar10);
        auVar2 = vphaddd_avx2(auVar11,auVar11);
        auVar46 = vpmovsxdq_avx2(auVar46._16_16_);
        auVar50 = vphaddd_avx2(auVar50,auVar2);
        auVar46 = vpaddq_avx2(auVar3,auVar46);
        auVar2 = vpmovsxdq_avx2(auVar50._0_16_);
        auVar50 = vpmovsxdq_avx2(auVar50._16_16_);
        auVar50 = vpaddq_avx2(auVar2,auVar50);
        *(undefined1 (*) [32])(H + lVar28 * 7) = auVar46;
        *(undefined1 (*) [16])(H + lVar28 * 7 + 4) = auVar50._0_16_;
        H[lVar28 * 7 + 6] = auVar50._16_8_;
        lVar28 = lVar28 + 1;
        lVar13 = lVar13 + 2;
      } while (lVar28 != 7);
      local_80 = auVar43;
      uVar21 = dst_stride;
      for (local_1c8 = (int64_t *)0x0; auVar43 = local_80, local_1c8 != (int64_t *)0x7;
          local_1c8 = (int64_t *)((long)local_1c8 + 1)) {
        piVar16 = dgd_avg + (byte)((byte)lVar35 / 7);
        piVar25 = piVar16 + CONCAT44(iVar31,uVar21);
        local_200 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        local_220 = local_200;
        local_240 = local_200;
        local_260 = local_200;
        local_280 = local_200;
        local_2a0 = local_200;
        local_2c0 = local_200;
        piVar15 = piVar25;
        iVar22 = v_start;
        iVar34 = iVar37;
        do {
          iVar30 = v_end - iVar22;
          if (3 < v_end - iVar22) {
            iVar30 = iVar34;
          }
          if (use_downsampled_wiener_stats == 0) {
            iVar30 = iVar34;
          }
          iVar34 = iVar30;
          auVar44._0_2_ = (undefined2)iVar34;
          auVar44._2_2_ = auVar44._0_2_;
          auVar44._4_2_ = auVar44._0_2_;
          auVar44._6_2_ = auVar44._0_2_;
          auVar44._8_2_ = auVar44._0_2_;
          auVar44._10_2_ = auVar44._0_2_;
          auVar44._12_2_ = auVar44._0_2_;
          auVar44._14_2_ = auVar44._0_2_;
          auVar44._16_2_ = auVar44._0_2_;
          auVar44._18_2_ = auVar44._0_2_;
          auVar44._20_2_ = auVar44._0_2_;
          auVar44._22_2_ = auVar44._0_2_;
          auVar44._24_2_ = auVar44._0_2_;
          auVar44._26_2_ = auVar44._0_2_;
          auVar44._28_2_ = auVar44._0_2_;
          auVar44._30_2_ = auVar44._0_2_;
          pauVar14 = (undefined1 (*) [32])(piVar16 + CONCAT44(iVar31,uVar21));
          uVar32 = 0;
          while( true ) {
            if (lVar41 <= (long)uVar32) break;
            auVar43 = vpmullw_avx2(auVar44,*(undefined1 (*) [32])(piVar15 + uVar32));
            pauVar20 = pauVar14;
            for (lVar13 = 0; lVar13 != 0xc0; lVar13 = lVar13 + 0x20) {
              auVar46 = vpmaddwd_avx2(auVar43,*pauVar20);
              auVar46 = vpaddd_avx2(auVar46,*(undefined1 (*) [32])(local_2c0 + lVar13));
              *(undefined1 (*) [32])(local_2c0 + lVar13) = auVar46;
              pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar23);
            }
            uVar32 = uVar32 + 0x10;
            pauVar14 = pauVar14 + 1;
          }
          if (uVar18 != 0) {
            auVar43 = vpand_avx2(local_80,*(undefined1 (*) [32])(piVar15 + (uVar32 & 0xffffffff)));
            auVar43 = vpmullw_avx2(auVar44,auVar43);
            for (lVar13 = 0; lVar13 != 0xc0; lVar13 = lVar13 + 0x20) {
              auVar46 = vpmaddwd_avx2(auVar43,*pauVar14);
              auVar46 = vpaddd_avx2(auVar46,*(undefined1 (*) [32])(local_2c0 + lVar13));
              *(undefined1 (*) [32])(local_2c0 + lVar13) = auVar46;
              pauVar14 = (undefined1 (*) [32])(*pauVar14 + lVar23);
            }
          }
          iVar22 = iVar22 + iVar34;
          piVar16 = piVar16 + (int)(iVar34 * dst_stride);
          piVar15 = piVar15 + (int)(iVar34 * dst_stride);
        } while (iVar22 < v_end);
        auVar43 = vphaddd_avx2(local_2c0,local_2a0);
        auVar46 = vphaddd_avx2(local_280,local_260);
        auVar43 = vphaddd_avx2(auVar43,auVar46);
        auVar46 = vpmovsxdq_avx2(auVar43._0_16_);
        auVar43 = vpmovsxdq_avx2(auVar43._16_16_);
        auVar43 = vpaddq_avx2(auVar46,auVar43);
        piVar78 = H + lVar35 * 0x31;
        *(undefined1 (*) [32])(piVar78 + lVar35) = auVar43;
        src0[1]._0_4_ = uVar21;
        src0[0] = lVar35;
        src0[1]._4_4_ = iVar31;
        src0[2]._0_4_ = (int)piVar25;
        src0[2]._4_4_ = (int)((ulong)piVar25 >> 0x20);
        src0[3] = (longlong)piVar78;
        src1[1]._0_4_ = iVar37;
        src1[0] = uVar33;
        src1[1]._4_4_ = uVar79;
        src1[2] = (longlong)dgd_avg;
        src1[3]._0_1_ = bVar80;
        src1[3]._1_7_ = uVar82;
        iVar42 = local_240._0_8_;
        iVar52 = local_240._8_8_;
        convert_32_to_64_add_avx2(src0,src1);
        piVar78[lVar35 + 4] = iVar42;
        (piVar78 + lVar35 + 4)[1] = iVar52;
        lVar13 = local_188;
        piVar29 = local_1c8;
        while (piVar29 < 6) {
          piVar29 = (int64_t *)((long)piVar29 + 1);
          local_200._0_16_ = ZEXT816(0);
          local_200 = ZEXT1632(local_200._0_16_);
          local_220._0_16_ = ZEXT816(0);
          local_220 = ZEXT1632(local_220._0_16_);
          local_240._0_16_ = ZEXT816(0);
          local_240 = ZEXT1632(local_240._0_16_);
          local_260._0_16_ = ZEXT816(0);
          local_260 = ZEXT1632(local_260._0_16_);
          local_280._0_16_ = ZEXT816(0);
          local_280 = ZEXT1632(local_280._0_16_);
          local_2a0._0_16_ = ZEXT816(0);
          local_2a0 = ZEXT1632(local_2a0._0_16_);
          local_2c0._0_16_ = ZEXT816(0);
          local_2c0 = ZEXT1632(local_2c0._0_16_);
          piVar15 = piVar25;
          piVar16 = dgd_avg;
          iVar22 = v_start;
          iVar34 = iVar37;
          do {
            iVar30 = v_end - iVar22;
            if (3 < v_end - iVar22) {
              iVar30 = iVar34;
            }
            if (use_downsampled_wiener_stats == 0) {
              iVar30 = iVar34;
            }
            iVar34 = iVar30;
            auVar45._0_2_ = (undefined2)iVar34;
            auVar45._2_2_ = auVar45._0_2_;
            auVar45._4_2_ = auVar45._0_2_;
            auVar45._6_2_ = auVar45._0_2_;
            auVar45._8_2_ = auVar45._0_2_;
            auVar45._10_2_ = auVar45._0_2_;
            auVar45._12_2_ = auVar45._0_2_;
            auVar45._14_2_ = auVar45._0_2_;
            auVar45._16_2_ = auVar45._0_2_;
            auVar45._18_2_ = auVar45._0_2_;
            auVar45._20_2_ = auVar45._0_2_;
            auVar45._22_2_ = auVar45._0_2_;
            auVar45._24_2_ = auVar45._0_2_;
            auVar45._26_2_ = auVar45._0_2_;
            auVar45._28_2_ = auVar45._0_2_;
            auVar45._30_2_ = auVar45._0_2_;
            pauVar14 = (undefined1 (*) [32])((long)piVar16 + lVar13);
            for (uVar33 = 0; (long)uVar33 < lVar41; uVar33 = uVar33 + 0x10) {
              auVar43 = vpmullw_avx2(auVar45,*(undefined1 (*) [32])(piVar15 + uVar33));
              pauVar20 = pauVar14;
              for (lVar28 = 0; lVar28 != 0xe0; lVar28 = lVar28 + 0x20) {
                auVar46 = vpmaddwd_avx2(auVar43,*pauVar20);
                auVar46 = vpaddd_avx2(auVar46,*(undefined1 (*) [32])(local_2c0 + lVar28));
                *(undefined1 (*) [32])(local_2c0 + lVar28) = auVar46;
                pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar23);
              }
              pauVar14 = pauVar14 + 1;
            }
            if (uVar18 != 0) {
              auVar43 = vpand_avx2(local_80,*(undefined1 (*) [32])(piVar15 + (uVar33 & 0xffffffff)))
              ;
              auVar43 = vpmullw_avx2(auVar45,auVar43);
              for (lVar28 = 0; lVar28 != 0xe0; lVar28 = lVar28 + 0x20) {
                auVar46 = vpmaddwd_avx2(auVar43,*pauVar14);
                auVar46 = vpaddd_avx2(auVar46,*(undefined1 (*) [32])(local_2c0 + lVar28));
                *(undefined1 (*) [32])(local_2c0 + lVar28) = auVar46;
                pauVar14 = (undefined1 (*) [32])(*pauVar14 + lVar23);
              }
            }
            iVar22 = iVar22 + iVar34;
            piVar16 = piVar16 + (int)(iVar34 * dst_stride);
            piVar15 = piVar15 + (int)(iVar34 * dst_stride);
          } while (iVar22 < v_end);
          auVar43 = vphaddd_avx2(local_2c0,local_2a0);
          auVar46 = vphaddd_avx2(local_280,local_260);
          auVar43 = vphaddd_avx2(auVar43,auVar46);
          auVar46 = vpmovsxdq_avx2(auVar43._0_16_);
          auVar43 = vpmovsxdq_avx2(auVar43._16_16_);
          auVar43 = vpaddq_avx2(auVar46,auVar43);
          *(undefined1 (*) [32])(piVar78 + (long)piVar29 * 7) = auVar43;
          auVar43 = vphaddd_avx2(local_240,local_220);
          auVar46 = vphaddd_avx2(local_200,local_200);
          auVar43 = vphaddd_avx2(auVar43,auVar46);
          auVar46 = vpmovsxdq_avx2(auVar43._0_16_);
          auVar43 = vpmovsxdq_avx2(auVar43._16_16_);
          auVar43 = vpaddq_avx2(auVar46,auVar43);
          *(undefined1 (*) [32])(piVar78 + (long)piVar29 * 7 + 4) = auVar43;
          lVar13 = lVar13 + 2;
          uVar33 = (ulong)piVar29;
        }
        lVar35 = lVar35 + 7;
        local_188 = local_188 + 2;
      }
      lVar35 = 2;
      local_188 = 2;
      for (uVar33 = 0; uVar33 != 7; uVar33 = uVar33 + 1) {
        local_1c8 = (int64_t *)lVar35;
        piVar16 = dgd_avg + (byte)(((ushort)lVar35 & 0xff) / 7);
        piVar25 = piVar16 + (int)(dst_stride * 2);
        local_200._0_16_ = ZEXT816(0);
        local_200 = ZEXT1632(local_200._0_16_);
        local_220._0_16_ = ZEXT816(0);
        local_220 = ZEXT1632(local_220._0_16_);
        local_240._0_16_ = ZEXT816(0);
        local_240 = ZEXT1632(local_240._0_16_);
        local_260._0_16_ = ZEXT816(0);
        local_260 = ZEXT1632(local_260._0_16_);
        local_280._0_16_ = ZEXT816(0);
        local_280 = ZEXT1632(local_280._0_16_);
        local_2a0._0_16_ = ZEXT816(0);
        local_2a0 = ZEXT1632(local_2a0._0_16_);
        local_2c0._0_16_ = ZEXT816(0);
        local_2c0 = ZEXT1632(local_2c0._0_16_);
        piVar15 = piVar25;
        iVar31 = v_start;
        iVar22 = iVar37;
        do {
          iVar34 = v_end - iVar31;
          if (3 < v_end - iVar31) {
            iVar34 = iVar22;
          }
          if (use_downsampled_wiener_stats == 0) {
            iVar34 = iVar22;
          }
          iVar22 = iVar34;
          auVar57._0_2_ = (undefined2)iVar22;
          auVar57._2_2_ = auVar57._0_2_;
          auVar57._4_2_ = auVar57._0_2_;
          auVar57._6_2_ = auVar57._0_2_;
          auVar57._8_2_ = auVar57._0_2_;
          auVar57._10_2_ = auVar57._0_2_;
          auVar57._12_2_ = auVar57._0_2_;
          auVar57._14_2_ = auVar57._0_2_;
          auVar57._16_2_ = auVar57._0_2_;
          auVar57._18_2_ = auVar57._0_2_;
          auVar57._20_2_ = auVar57._0_2_;
          auVar57._22_2_ = auVar57._0_2_;
          auVar57._24_2_ = auVar57._0_2_;
          auVar57._26_2_ = auVar57._0_2_;
          auVar57._28_2_ = auVar57._0_2_;
          auVar57._30_2_ = auVar57._0_2_;
          pauVar14 = (undefined1 (*) [32])(piVar16 + (int)(dst_stride * 2));
          for (uVar32 = 0; (long)uVar32 < lVar41; uVar32 = uVar32 + 0x10) {
            auVar46 = vpmullw_avx2(auVar57,*(undefined1 (*) [32])(piVar15 + uVar32));
            pauVar20 = pauVar14;
            for (lVar13 = 0; lVar13 != 0xa0; lVar13 = lVar13 + 0x20) {
              auVar50 = vpmaddwd_avx2(auVar46,*pauVar20);
              auVar50 = vpaddd_avx2(auVar50,*(undefined1 (*) [32])(local_2c0 + lVar13));
              *(undefined1 (*) [32])(local_2c0 + lVar13) = auVar50;
              pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar23);
            }
            pauVar14 = pauVar14 + 1;
          }
          if (uVar18 != 0) {
            auVar46 = vpand_avx2(local_80,*(undefined1 (*) [32])(piVar15 + (uVar32 & 0xffffffff)));
            auVar46 = vpmullw_avx2(auVar57,auVar46);
            for (lVar13 = 0; lVar13 != 0xa0; lVar13 = lVar13 + 0x20) {
              auVar50 = vpmaddwd_avx2(auVar46,*pauVar14);
              auVar50 = vpaddd_avx2(auVar50,*(undefined1 (*) [32])(local_2c0 + lVar13));
              *(undefined1 (*) [32])(local_2c0 + lVar13) = auVar50;
              pauVar14 = (undefined1 (*) [32])(*pauVar14 + lVar23);
            }
          }
          iVar31 = iVar31 + iVar22;
          piVar16 = piVar16 + (int)(iVar22 * dst_stride);
          piVar15 = piVar15 + (int)(iVar22 * dst_stride);
        } while (iVar31 < v_end);
        auVar46 = vphaddd_avx2(local_2c0,local_2a0);
        auVar50 = vphaddd_avx2(local_280,local_260);
        auVar46 = vphaddd_avx2(auVar46,auVar50);
        auVar50 = vpmovsxdq_avx2(auVar46._0_16_);
        auVar46 = vpmovsxdq_avx2(auVar46._16_16_);
        auVar46 = vpaddq_avx2(auVar50,auVar46);
        *(undefined1 (*) [32])(H + lVar35 * 0x32) = auVar46;
        auVar46 = vpmovsxdq_avx2(local_240._0_16_);
        auVar50 = vpmovsxdq_avx2(local_240._16_16_);
        auVar46 = vpaddq_avx2(auVar46,auVar50);
        auVar50 = vpshufd_avx2(auVar46,0x44);
        auVar46 = vpshufd_avx2(auVar46,0xee);
        auVar46 = vpaddq_avx2(auVar50,auVar46);
        auVar53 = vpaddq_avx(auVar46._0_16_,auVar46._16_16_);
        H[lVar35 * 0x32 + 4] = auVar53._0_8_;
        uVar32 = uVar33;
        lVar13 = local_188;
        while (uVar32 < 6) {
          uVar32 = uVar32 + 1;
          local_200._0_16_ = ZEXT816(0);
          local_200 = ZEXT1632(local_200._0_16_);
          local_220._0_16_ = ZEXT816(0);
          local_220 = ZEXT1632(local_220._0_16_);
          local_240._0_16_ = ZEXT816(0);
          local_240 = ZEXT1632(local_240._0_16_);
          local_260._0_16_ = ZEXT816(0);
          local_260 = ZEXT1632(local_260._0_16_);
          local_280._0_16_ = ZEXT816(0);
          local_280 = ZEXT1632(local_280._0_16_);
          local_2a0._0_16_ = ZEXT816(0);
          local_2a0 = ZEXT1632(local_2a0._0_16_);
          local_2c0._0_16_ = ZEXT816(0);
          local_2c0 = ZEXT1632(local_2c0._0_16_);
          piVar15 = piVar25;
          piVar16 = dgd_avg;
          iVar31 = iVar37;
          iVar22 = v_start;
          do {
            iVar34 = v_end - iVar22;
            if (3 < v_end - iVar22) {
              iVar34 = iVar31;
            }
            if (use_downsampled_wiener_stats == 0) {
              iVar34 = iVar31;
            }
            iVar31 = iVar34;
            auVar58._0_2_ = (undefined2)iVar31;
            auVar58._2_2_ = auVar58._0_2_;
            auVar58._4_2_ = auVar58._0_2_;
            auVar58._6_2_ = auVar58._0_2_;
            auVar58._8_2_ = auVar58._0_2_;
            auVar58._10_2_ = auVar58._0_2_;
            auVar58._12_2_ = auVar58._0_2_;
            auVar58._14_2_ = auVar58._0_2_;
            auVar58._16_2_ = auVar58._0_2_;
            auVar58._18_2_ = auVar58._0_2_;
            auVar58._20_2_ = auVar58._0_2_;
            auVar58._22_2_ = auVar58._0_2_;
            auVar58._24_2_ = auVar58._0_2_;
            auVar58._26_2_ = auVar58._0_2_;
            auVar58._28_2_ = auVar58._0_2_;
            auVar58._30_2_ = auVar58._0_2_;
            pauVar14 = (undefined1 (*) [32])((long)piVar16 + lVar13);
            for (uVar24 = 0; (long)uVar24 < lVar41; uVar24 = uVar24 + 0x10) {
              auVar46 = vpmullw_avx2(auVar58,*(undefined1 (*) [32])(piVar15 + uVar24));
              pauVar20 = pauVar14;
              for (lVar28 = 0; lVar28 != 0xe0; lVar28 = lVar28 + 0x20) {
                auVar50 = vpmaddwd_avx2(auVar46,*pauVar20);
                auVar50 = vpaddd_avx2(auVar50,*(undefined1 (*) [32])(local_2c0 + lVar28));
                *(undefined1 (*) [32])(local_2c0 + lVar28) = auVar50;
                pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar23);
              }
              pauVar14 = pauVar14 + 1;
            }
            if (uVar18 != 0) {
              auVar46 = vpand_avx2(local_80,*(undefined1 (*) [32])(piVar15 + (uVar24 & 0xffffffff)))
              ;
              auVar46 = vpmullw_avx2(auVar58,auVar46);
              for (lVar28 = 0; lVar28 != 0xe0; lVar28 = lVar28 + 0x20) {
                auVar50 = vpmaddwd_avx2(auVar46,*pauVar14);
                auVar50 = vpaddd_avx2(auVar50,*(undefined1 (*) [32])(local_2c0 + lVar28));
                *(undefined1 (*) [32])(local_2c0 + lVar28) = auVar50;
                pauVar14 = (undefined1 (*) [32])(*pauVar14 + lVar23);
              }
            }
            iVar22 = iVar22 + iVar31;
            piVar16 = piVar16 + (int)(iVar31 * dst_stride);
            piVar15 = piVar15 + (int)(iVar31 * dst_stride);
          } while (iVar22 < v_end);
          auVar46 = vphaddd_avx2(local_2c0,local_2a0);
          auVar50 = vphaddd_avx2(local_280,local_260);
          auVar46 = vphaddd_avx2(auVar46,auVar50);
          auVar50 = vpmovsxdq_avx2(auVar46._0_16_);
          auVar46 = vpmovsxdq_avx2(auVar46._16_16_);
          auVar46 = vpaddq_avx2(auVar50,auVar46);
          *(undefined1 (*) [32])(H + lVar35 * 0x31 + uVar32 * 7) = auVar46;
          auVar46 = vphaddd_avx2(local_240,local_220);
          auVar50 = vphaddd_avx2(local_200,local_200);
          auVar46 = vphaddd_avx2(auVar46,auVar50);
          auVar50 = vpmovsxdq_avx2(auVar46._0_16_);
          auVar46 = vpmovsxdq_avx2(auVar46._16_16_);
          auVar46 = vpaddq_avx2(auVar50,auVar46);
          *(undefined1 (*) [32])(H + lVar35 * 0x31 + uVar32 * 7 + 4) = auVar46;
          lVar13 = lVar13 + 2;
        }
        lVar35 = (long)local_1c8 + 7;
        local_188 = local_188 + 2;
      }
      local_1c8 = (int64_t *)0x2;
      for (uVar33 = 0; uVar33 != 7; uVar33 = uVar33 + 1) {
        piVar16 = dgd_avg + bVar80 / 7;
        piVar25 = piVar16 + (int)(dst_stride * 3);
        local_200._0_16_ = ZEXT816(0);
        local_200 = ZEXT1632(local_200._0_16_);
        local_220._0_16_ = ZEXT816(0);
        local_220 = ZEXT1632(local_220._0_16_);
        local_240._0_16_ = ZEXT816(0);
        local_240 = ZEXT1632(local_240._0_16_);
        local_260._0_16_ = ZEXT816(0);
        local_260 = ZEXT1632(local_260._0_16_);
        local_280._0_16_ = ZEXT816(0);
        local_280 = ZEXT1632(local_280._0_16_);
        local_2a0._0_16_ = ZEXT816(0);
        local_2a0 = ZEXT1632(local_2a0._0_16_);
        local_2c0._0_16_ = ZEXT816(0);
        local_2c0 = ZEXT1632(local_2c0._0_16_);
        piVar15 = piVar25;
        iVar31 = v_start;
        iVar22 = iVar37;
        do {
          iVar34 = v_end - iVar31;
          if (3 < v_end - iVar31) {
            iVar34 = iVar22;
          }
          if (use_downsampled_wiener_stats == 0) {
            iVar34 = iVar22;
          }
          iVar22 = iVar34;
          auVar61._0_2_ = (undefined2)iVar22;
          auVar61._2_2_ = auVar61._0_2_;
          auVar61._4_2_ = auVar61._0_2_;
          auVar61._6_2_ = auVar61._0_2_;
          auVar61._8_2_ = auVar61._0_2_;
          auVar61._10_2_ = auVar61._0_2_;
          auVar61._12_2_ = auVar61._0_2_;
          auVar61._14_2_ = auVar61._0_2_;
          auVar61._16_2_ = auVar61._0_2_;
          auVar61._18_2_ = auVar61._0_2_;
          auVar61._20_2_ = auVar61._0_2_;
          auVar61._22_2_ = auVar61._0_2_;
          auVar61._24_2_ = auVar61._0_2_;
          auVar61._26_2_ = auVar61._0_2_;
          auVar61._28_2_ = auVar61._0_2_;
          auVar61._30_2_ = auVar61._0_2_;
          pauVar14 = (undefined1 (*) [32])(piVar16 + (int)(dst_stride * 3));
          for (uVar32 = 0; (long)uVar32 < lVar41; uVar32 = uVar32 + 0x10) {
            auVar46 = vpmullw_avx2(auVar61,*(undefined1 (*) [32])(piVar15 + uVar32));
            pauVar20 = pauVar14;
            for (lVar35 = 0; lVar35 != 0x80; lVar35 = lVar35 + 0x20) {
              auVar50 = vpmaddwd_avx2(auVar46,*pauVar20);
              auVar50 = vpaddd_avx2(auVar50,*(undefined1 (*) [32])(local_2c0 + lVar35));
              *(undefined1 (*) [32])(local_2c0 + lVar35) = auVar50;
              pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar23);
            }
            pauVar14 = pauVar14 + 1;
          }
          if (uVar18 != 0) {
            auVar46 = vpand_avx2(auVar43,*(undefined1 (*) [32])(piVar15 + (uVar32 & 0xffffffff)));
            auVar46 = vpmullw_avx2(auVar61,auVar46);
            for (lVar35 = 0; lVar35 != 0x80; lVar35 = lVar35 + 0x20) {
              auVar50 = vpmaddwd_avx2(auVar46,*pauVar14);
              auVar50 = vpaddd_avx2(auVar50,*(undefined1 (*) [32])(local_2c0 + lVar35));
              *(undefined1 (*) [32])(local_2c0 + lVar35) = auVar50;
              pauVar14 = (undefined1 (*) [32])(*pauVar14 + lVar23);
            }
          }
          iVar31 = iVar31 + iVar22;
          piVar16 = piVar16 + (int)(iVar22 * dst_stride);
          piVar15 = piVar15 + (int)(iVar22 * dst_stride);
        } while (iVar31 < v_end);
        auVar46 = vphaddd_avx2(local_2c0,local_2a0);
        auVar50 = vphaddd_avx2(local_280,local_260);
        auVar46 = vphaddd_avx2(auVar46,auVar50);
        auVar50 = vpmovsxdq_avx2(auVar46._0_16_);
        auVar46 = vpmovsxdq_avx2(auVar46._16_16_);
        auVar46 = vpaddq_avx2(auVar50,auVar46);
        lVar35 = CONCAT71(uVar82,bVar80);
        *(undefined1 (*) [32])(H + lVar35 * 0x32) = auVar46;
        uVar32 = uVar33;
        piVar29 = local_1c8;
        while (uVar32 < 6) {
          uVar32 = uVar32 + 1;
          local_200._0_16_ = ZEXT816(0);
          local_200 = ZEXT1632(local_200._0_16_);
          local_220._0_16_ = ZEXT816(0);
          local_220 = ZEXT1632(local_220._0_16_);
          local_240._0_16_ = ZEXT816(0);
          local_240 = ZEXT1632(local_240._0_16_);
          local_260._0_16_ = ZEXT816(0);
          local_260 = ZEXT1632(local_260._0_16_);
          local_280._0_16_ = ZEXT816(0);
          local_280 = ZEXT1632(local_280._0_16_);
          local_2a0._0_16_ = ZEXT816(0);
          local_2a0 = ZEXT1632(local_2a0._0_16_);
          local_2c0._0_16_ = ZEXT816(0);
          local_2c0 = ZEXT1632(local_2c0._0_16_);
          piVar15 = piVar25;
          piVar16 = dgd_avg;
          iVar31 = iVar37;
          iVar22 = v_start;
          do {
            iVar34 = v_end - iVar22;
            if (3 < v_end - iVar22) {
              iVar34 = iVar31;
            }
            if (use_downsampled_wiener_stats == 0) {
              iVar34 = iVar31;
            }
            iVar31 = iVar34;
            auVar62._0_2_ = (undefined2)iVar31;
            auVar62._2_2_ = auVar62._0_2_;
            auVar62._4_2_ = auVar62._0_2_;
            auVar62._6_2_ = auVar62._0_2_;
            auVar62._8_2_ = auVar62._0_2_;
            auVar62._10_2_ = auVar62._0_2_;
            auVar62._12_2_ = auVar62._0_2_;
            auVar62._14_2_ = auVar62._0_2_;
            auVar62._16_2_ = auVar62._0_2_;
            auVar62._18_2_ = auVar62._0_2_;
            auVar62._20_2_ = auVar62._0_2_;
            auVar62._22_2_ = auVar62._0_2_;
            auVar62._24_2_ = auVar62._0_2_;
            auVar62._26_2_ = auVar62._0_2_;
            auVar62._28_2_ = auVar62._0_2_;
            auVar62._30_2_ = auVar62._0_2_;
            pauVar14 = (undefined1 (*) [32])((long)piVar16 + (long)piVar29);
            for (uVar24 = 0; (long)uVar24 < lVar41; uVar24 = uVar24 + 0x10) {
              auVar46 = vpmullw_avx2(auVar62,*(undefined1 (*) [32])(piVar15 + uVar24));
              pauVar20 = pauVar14;
              for (lVar13 = 0; lVar13 != 0xe0; lVar13 = lVar13 + 0x20) {
                auVar50 = vpmaddwd_avx2(auVar46,*pauVar20);
                auVar50 = vpaddd_avx2(auVar50,*(undefined1 (*) [32])(local_2c0 + lVar13));
                *(undefined1 (*) [32])(local_2c0 + lVar13) = auVar50;
                pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar23);
              }
              pauVar14 = pauVar14 + 1;
            }
            if (uVar18 != 0) {
              auVar46 = vpand_avx2(auVar43,*(undefined1 (*) [32])(piVar15 + (uVar24 & 0xffffffff)));
              auVar46 = vpmullw_avx2(auVar62,auVar46);
              for (lVar13 = 0; lVar13 != 0xe0; lVar13 = lVar13 + 0x20) {
                auVar50 = vpmaddwd_avx2(auVar46,*pauVar14);
                auVar50 = vpaddd_avx2(auVar50,*(undefined1 (*) [32])(local_2c0 + lVar13));
                *(undefined1 (*) [32])(local_2c0 + lVar13) = auVar50;
                pauVar14 = (undefined1 (*) [32])(*pauVar14 + lVar23);
              }
            }
            iVar22 = iVar22 + iVar31;
            piVar16 = piVar16 + (int)(iVar31 * dst_stride);
            piVar15 = piVar15 + (int)(iVar31 * dst_stride);
          } while (iVar22 < v_end);
          auVar46 = vphaddd_avx2(local_2c0,local_2a0);
          auVar50 = vphaddd_avx2(local_280,local_260);
          auVar46 = vphaddd_avx2(auVar46,auVar50);
          auVar50 = vpmovsxdq_avx2(auVar46._0_16_);
          auVar46 = vpmovsxdq_avx2(auVar46._16_16_);
          auVar46 = vpaddq_avx2(auVar50,auVar46);
          *(undefined1 (*) [32])(H + lVar35 * 0x31 + uVar32 * 7) = auVar46;
          auVar46 = vphaddd_avx2(local_240,local_220);
          auVar50 = vphaddd_avx2(local_200,local_200);
          auVar46 = vphaddd_avx2(auVar46,auVar50);
          auVar50 = vpmovsxdq_avx2(auVar46._0_16_);
          auVar46 = vpmovsxdq_avx2(auVar46._16_16_);
          auVar46 = vpaddq_avx2(auVar50,auVar46);
          *(undefined1 (*) [32])(H + lVar35 * 0x31 + uVar32 * 7 + 4) = auVar46;
          piVar29 = (int64_t *)((long)piVar29 + 2);
        }
        lVar35 = CONCAT71(uVar82,bVar80) + 7;
        bVar80 = (byte)lVar35;
        uVar82 = (undefined7)((ulong)lVar35 >> 8);
        local_1c8 = (int64_t *)((long)local_1c8 + 2);
      }
      uVar81 = 2;
      uVar82 = 0;
      for (uVar33 = 0; uVar33 != 7; uVar33 = uVar33 + 1) {
        piVar16 = dgd_avg + local_1c0[0] / 7;
        piVar25 = piVar16 + (int)(dst_stride * 4);
        local_200._0_16_ = ZEXT816(0);
        local_200 = ZEXT1632(local_200._0_16_);
        local_220._0_16_ = ZEXT816(0);
        local_220 = ZEXT1632(local_220._0_16_);
        local_240._0_16_ = ZEXT816(0);
        local_240 = ZEXT1632(local_240._0_16_);
        local_260._0_16_ = ZEXT816(0);
        local_260 = ZEXT1632(local_260._0_16_);
        local_280._0_16_ = ZEXT816(0);
        local_280 = ZEXT1632(local_280._0_16_);
        local_2a0._0_16_ = ZEXT816(0);
        local_2a0 = ZEXT1632(local_2a0._0_16_);
        local_2c0._0_16_ = ZEXT816(0);
        local_2c0 = ZEXT1632(local_2c0._0_16_);
        piVar15 = piVar25;
        iVar31 = v_start;
        iVar22 = iVar37;
        do {
          iVar34 = v_end - iVar31;
          if (3 < v_end - iVar31) {
            iVar34 = iVar22;
          }
          if (use_downsampled_wiener_stats == 0) {
            iVar34 = iVar22;
          }
          iVar22 = iVar34;
          auVar63._0_2_ = (undefined2)iVar22;
          auVar63._2_2_ = auVar63._0_2_;
          auVar63._4_2_ = auVar63._0_2_;
          auVar63._6_2_ = auVar63._0_2_;
          auVar63._8_2_ = auVar63._0_2_;
          auVar63._10_2_ = auVar63._0_2_;
          auVar63._12_2_ = auVar63._0_2_;
          auVar63._14_2_ = auVar63._0_2_;
          auVar63._16_2_ = auVar63._0_2_;
          auVar63._18_2_ = auVar63._0_2_;
          auVar63._20_2_ = auVar63._0_2_;
          auVar63._22_2_ = auVar63._0_2_;
          auVar63._24_2_ = auVar63._0_2_;
          auVar63._26_2_ = auVar63._0_2_;
          auVar63._28_2_ = auVar63._0_2_;
          auVar63._30_2_ = auVar63._0_2_;
          pauVar14 = (undefined1 (*) [32])(piVar16 + (int)(dst_stride * 4));
          for (uVar32 = 0; (long)uVar32 < lVar41; uVar32 = uVar32 + 0x10) {
            auVar46 = vpmullw_avx2(auVar63,*(undefined1 (*) [32])(piVar15 + uVar32));
            pauVar20 = pauVar14;
            for (lVar35 = 0; lVar35 != 0x60; lVar35 = lVar35 + 0x20) {
              auVar50 = vpmaddwd_avx2(auVar46,*pauVar20);
              auVar50 = vpaddd_avx2(auVar50,*(undefined1 (*) [32])(local_2c0 + lVar35));
              *(undefined1 (*) [32])(local_2c0 + lVar35) = auVar50;
              pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar23);
            }
            pauVar14 = pauVar14 + 1;
          }
          if (uVar18 != 0) {
            auVar46 = vpand_avx2(auVar43,*(undefined1 (*) [32])(piVar15 + (uVar32 & 0xffffffff)));
            auVar46 = vpmullw_avx2(auVar63,auVar46);
            for (lVar35 = 0; lVar35 != 0x60; lVar35 = lVar35 + 0x20) {
              auVar50 = vpmaddwd_avx2(auVar46,*pauVar14);
              auVar50 = vpaddd_avx2(auVar50,*(undefined1 (*) [32])(local_2c0 + lVar35));
              *(undefined1 (*) [32])(local_2c0 + lVar35) = auVar50;
              pauVar14 = (undefined1 (*) [32])(*pauVar14 + lVar23);
            }
          }
          iVar31 = iVar31 + iVar22;
          piVar16 = piVar16 + (int)(iVar22 * dst_stride);
          piVar15 = piVar15 + (int)(iVar22 * dst_stride);
        } while (iVar31 < v_end);
        auVar46 = vphaddd_avx2(local_2c0,local_2a0);
        auVar50 = vphaddd_avx2(local_280,local_260);
        auVar46 = vphaddd_avx2(auVar46,auVar50);
        auVar50 = vpmovsxdq_avx2(auVar46._0_16_);
        auVar46 = vpmovsxdq_avx2(auVar46._16_16_);
        auVar46 = vpaddq_avx2(auVar50,auVar46);
        *(undefined1 (*) [32])(H + local_1c0._0_8_ * 0x32) = auVar46;
        lVar35 = CONCAT71(uVar82,uVar81);
        uVar32 = uVar33;
        while (uVar32 < 6) {
          uVar32 = uVar32 + 1;
          local_200._0_16_ = ZEXT816(0);
          local_200 = ZEXT1632(local_200._0_16_);
          local_220._0_16_ = ZEXT816(0);
          local_220 = ZEXT1632(local_220._0_16_);
          local_240._0_16_ = ZEXT816(0);
          local_240 = ZEXT1632(local_240._0_16_);
          local_260._0_16_ = ZEXT816(0);
          local_260 = ZEXT1632(local_260._0_16_);
          local_280._0_16_ = ZEXT816(0);
          local_280 = ZEXT1632(local_280._0_16_);
          local_2a0._0_16_ = ZEXT816(0);
          local_2a0 = ZEXT1632(local_2a0._0_16_);
          local_2c0._0_16_ = ZEXT816(0);
          local_2c0 = ZEXT1632(local_2c0._0_16_);
          piVar15 = piVar25;
          piVar16 = dgd_avg;
          iVar31 = iVar37;
          iVar22 = v_start;
          do {
            iVar34 = v_end - iVar22;
            if (3 < v_end - iVar22) {
              iVar34 = iVar31;
            }
            if (use_downsampled_wiener_stats == 0) {
              iVar34 = iVar31;
            }
            iVar31 = iVar34;
            auVar64._0_2_ = (undefined2)iVar31;
            auVar64._2_2_ = auVar64._0_2_;
            auVar64._4_2_ = auVar64._0_2_;
            auVar64._6_2_ = auVar64._0_2_;
            auVar64._8_2_ = auVar64._0_2_;
            auVar64._10_2_ = auVar64._0_2_;
            auVar64._12_2_ = auVar64._0_2_;
            auVar64._14_2_ = auVar64._0_2_;
            auVar64._16_2_ = auVar64._0_2_;
            auVar64._18_2_ = auVar64._0_2_;
            auVar64._20_2_ = auVar64._0_2_;
            auVar64._22_2_ = auVar64._0_2_;
            auVar64._24_2_ = auVar64._0_2_;
            auVar64._26_2_ = auVar64._0_2_;
            auVar64._28_2_ = auVar64._0_2_;
            auVar64._30_2_ = auVar64._0_2_;
            pauVar14 = (undefined1 (*) [32])((long)piVar16 + lVar35);
            for (uVar24 = 0; (long)uVar24 < lVar41; uVar24 = uVar24 + 0x10) {
              auVar46 = vpmullw_avx2(auVar64,*(undefined1 (*) [32])(piVar15 + uVar24));
              pauVar20 = pauVar14;
              for (lVar13 = 0; lVar13 != 0xe0; lVar13 = lVar13 + 0x20) {
                auVar50 = vpmaddwd_avx2(auVar46,*pauVar20);
                auVar50 = vpaddd_avx2(auVar50,*(undefined1 (*) [32])(local_2c0 + lVar13));
                *(undefined1 (*) [32])(local_2c0 + lVar13) = auVar50;
                pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar23);
              }
              pauVar14 = pauVar14 + 1;
            }
            if (uVar18 != 0) {
              auVar46 = vpand_avx2(auVar43,*(undefined1 (*) [32])(piVar15 + (uVar24 & 0xffffffff)));
              auVar46 = vpmullw_avx2(auVar64,auVar46);
              for (lVar13 = 0; lVar13 != 0xe0; lVar13 = lVar13 + 0x20) {
                auVar50 = vpmaddwd_avx2(auVar46,*pauVar14);
                auVar50 = vpaddd_avx2(auVar50,*(undefined1 (*) [32])(local_2c0 + lVar13));
                *(undefined1 (*) [32])(local_2c0 + lVar13) = auVar50;
                pauVar14 = (undefined1 (*) [32])(*pauVar14 + lVar23);
              }
            }
            iVar22 = iVar22 + iVar31;
            piVar16 = piVar16 + (int)(iVar31 * dst_stride);
            piVar15 = piVar15 + (int)(iVar31 * dst_stride);
          } while (iVar22 < v_end);
          auVar46 = vphaddd_avx2(local_2c0,local_2a0);
          auVar50 = vphaddd_avx2(local_280,local_260);
          auVar46 = vphaddd_avx2(auVar46,auVar50);
          auVar50 = vpmovsxdq_avx2(auVar46._0_16_);
          auVar46 = vpmovsxdq_avx2(auVar46._16_16_);
          auVar46 = vpaddq_avx2(auVar50,auVar46);
          *(undefined1 (*) [32])(H + local_1c0._0_8_ * 0x31 + uVar32 * 7) = auVar46;
          auVar46 = vphaddd_avx2(local_240,local_220);
          auVar50 = vphaddd_avx2(local_200,local_200);
          auVar46 = vphaddd_avx2(auVar46,auVar50);
          auVar50 = vpmovsxdq_avx2(auVar46._0_16_);
          auVar46 = vpmovsxdq_avx2(auVar46._16_16_);
          auVar46 = vpaddq_avx2(auVar50,auVar46);
          *(undefined1 (*) [32])(H + local_1c0._0_8_ * 0x31 + uVar32 * 7 + 4) = auVar46;
          lVar35 = lVar35 + 2;
        }
        local_1c0._0_8_ = local_1c0._0_8_ + 7;
        lVar35 = CONCAT71(uVar82,uVar81) + 2;
        uVar81 = (undefined1)lVar35;
        uVar82 = (undefined7)((ulong)lVar35 >> 8);
      }
      local_1c0._0_8_ = 2;
      for (uVar33 = 0; uVar33 != 7; uVar33 = uVar33 + 1) {
        piVar16 = dgd_avg + local_180[0] / 7;
        piVar25 = piVar16 + (int)(dst_stride * 5);
        local_200._0_16_ = ZEXT816(0);
        local_200 = ZEXT1632(local_200._0_16_);
        local_220._0_16_ = ZEXT816(0);
        local_220 = ZEXT1632(local_220._0_16_);
        local_240._0_16_ = ZEXT816(0);
        local_240 = ZEXT1632(local_240._0_16_);
        local_260._0_16_ = ZEXT816(0);
        local_260 = ZEXT1632(local_260._0_16_);
        local_280._0_16_ = ZEXT816(0);
        local_280 = ZEXT1632(local_280._0_16_);
        local_2a0._0_16_ = ZEXT816(0);
        local_2a0 = ZEXT1632(local_2a0._0_16_);
        local_2c0._0_16_ = ZEXT816(0);
        local_2c0 = ZEXT1632(local_2c0._0_16_);
        piVar15 = piVar25;
        iVar31 = v_start;
        iVar22 = iVar37;
        do {
          iVar34 = v_end - iVar31;
          if (3 < v_end - iVar31) {
            iVar34 = iVar22;
          }
          if (use_downsampled_wiener_stats == 0) {
            iVar34 = iVar22;
          }
          iVar22 = iVar34;
          auVar66._0_2_ = (undefined2)iVar22;
          auVar66._2_2_ = auVar66._0_2_;
          auVar66._4_2_ = auVar66._0_2_;
          auVar66._6_2_ = auVar66._0_2_;
          auVar66._8_2_ = auVar66._0_2_;
          auVar66._10_2_ = auVar66._0_2_;
          auVar66._12_2_ = auVar66._0_2_;
          auVar66._14_2_ = auVar66._0_2_;
          auVar66._16_2_ = auVar66._0_2_;
          auVar66._18_2_ = auVar66._0_2_;
          auVar66._20_2_ = auVar66._0_2_;
          auVar66._22_2_ = auVar66._0_2_;
          auVar66._24_2_ = auVar66._0_2_;
          auVar66._26_2_ = auVar66._0_2_;
          auVar66._28_2_ = auVar66._0_2_;
          auVar66._30_2_ = auVar66._0_2_;
          pauVar14 = (undefined1 (*) [32])(piVar16 + (int)(dst_stride * 5));
          for (uVar32 = 0; (long)uVar32 < lVar41; uVar32 = uVar32 + 0x10) {
            auVar46 = vpmullw_avx2(auVar66,*(undefined1 (*) [32])(piVar15 + uVar32));
            pauVar20 = pauVar14;
            for (lVar35 = 0; lVar35 != 0x40; lVar35 = lVar35 + 0x20) {
              auVar50 = vpmaddwd_avx2(auVar46,*pauVar20);
              auVar50 = vpaddd_avx2(auVar50,*(undefined1 (*) [32])(local_2c0 + lVar35));
              *(undefined1 (*) [32])(local_2c0 + lVar35) = auVar50;
              pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar23);
            }
            pauVar14 = pauVar14 + 1;
          }
          if (uVar18 != 0) {
            auVar46 = vpand_avx2(auVar43,*(undefined1 (*) [32])(piVar15 + (uVar32 & 0xffffffff)));
            auVar46 = vpmullw_avx2(auVar66,auVar46);
            for (lVar35 = 0; lVar35 != 0x40; lVar35 = lVar35 + 0x20) {
              auVar50 = vpmaddwd_avx2(auVar46,*pauVar14);
              auVar50 = vpaddd_avx2(auVar50,*(undefined1 (*) [32])(local_2c0 + lVar35));
              *(undefined1 (*) [32])(local_2c0 + lVar35) = auVar50;
              pauVar14 = (undefined1 (*) [32])(*pauVar14 + lVar23);
            }
          }
          iVar31 = iVar31 + iVar22;
          piVar16 = piVar16 + (int)(iVar22 * dst_stride);
          piVar15 = piVar15 + (int)(iVar22 * dst_stride);
        } while (iVar31 < v_end);
        auVar46 = vphaddd_avx2(local_2c0,local_2a0);
        auVar50 = vphaddd_avx2(local_280,local_260);
        auVar46 = vphaddd_avx2(auVar46,auVar50);
        auVar50 = vpmovsxdq_avx2(auVar46._0_16_);
        auVar46 = vpmovsxdq_avx2(auVar46._16_16_);
        auVar46 = vpaddq_avx2(auVar50,auVar46);
        *(undefined1 (*) [32])(H + local_180._0_8_ * 0x32) = auVar46;
        uVar32 = uVar33;
        lVar35 = local_1c0._0_8_;
        while (uVar32 < 6) {
          uVar32 = uVar32 + 1;
          local_200._0_16_ = ZEXT816(0);
          local_200 = ZEXT1632(local_200._0_16_);
          local_220._0_16_ = ZEXT816(0);
          local_220 = ZEXT1632(local_220._0_16_);
          local_240._0_16_ = ZEXT816(0);
          local_240 = ZEXT1632(local_240._0_16_);
          local_260._0_16_ = ZEXT816(0);
          local_260 = ZEXT1632(local_260._0_16_);
          local_280._0_16_ = ZEXT816(0);
          local_280 = ZEXT1632(local_280._0_16_);
          local_2a0._0_16_ = ZEXT816(0);
          local_2a0 = ZEXT1632(local_2a0._0_16_);
          local_2c0._0_16_ = ZEXT816(0);
          local_2c0 = ZEXT1632(local_2c0._0_16_);
          piVar15 = piVar25;
          piVar16 = dgd_avg;
          iVar31 = v_start;
          iVar22 = iVar37;
          do {
            iVar34 = v_end - iVar31;
            if (3 < v_end - iVar31) {
              iVar34 = iVar22;
            }
            if (use_downsampled_wiener_stats == 0) {
              iVar34 = iVar22;
            }
            iVar22 = iVar34;
            auVar67._0_2_ = (undefined2)iVar22;
            auVar67._2_2_ = auVar67._0_2_;
            auVar67._4_2_ = auVar67._0_2_;
            auVar67._6_2_ = auVar67._0_2_;
            auVar67._8_2_ = auVar67._0_2_;
            auVar67._10_2_ = auVar67._0_2_;
            auVar67._12_2_ = auVar67._0_2_;
            auVar67._14_2_ = auVar67._0_2_;
            auVar67._16_2_ = auVar67._0_2_;
            auVar67._18_2_ = auVar67._0_2_;
            auVar67._20_2_ = auVar67._0_2_;
            auVar67._22_2_ = auVar67._0_2_;
            auVar67._24_2_ = auVar67._0_2_;
            auVar67._26_2_ = auVar67._0_2_;
            auVar67._28_2_ = auVar67._0_2_;
            auVar67._30_2_ = auVar67._0_2_;
            pauVar14 = (undefined1 (*) [32])((long)piVar16 + lVar35);
            for (uVar24 = 0; (long)uVar24 < lVar41; uVar24 = uVar24 + 0x10) {
              auVar46 = vpmullw_avx2(auVar67,*(undefined1 (*) [32])(piVar15 + uVar24));
              pauVar20 = pauVar14;
              for (lVar13 = 0; lVar13 != 0xe0; lVar13 = lVar13 + 0x20) {
                auVar50 = vpmaddwd_avx2(auVar46,*pauVar20);
                auVar50 = vpaddd_avx2(auVar50,*(undefined1 (*) [32])(local_2c0 + lVar13));
                *(undefined1 (*) [32])(local_2c0 + lVar13) = auVar50;
                pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar23);
              }
              pauVar14 = pauVar14 + 1;
            }
            if (uVar18 != 0) {
              auVar46 = vpand_avx2(auVar43,*(undefined1 (*) [32])(piVar15 + (uVar24 & 0xffffffff)));
              auVar46 = vpmullw_avx2(auVar67,auVar46);
              for (lVar13 = 0; lVar13 != 0xe0; lVar13 = lVar13 + 0x20) {
                auVar50 = vpmaddwd_avx2(auVar46,*pauVar14);
                auVar50 = vpaddd_avx2(auVar50,*(undefined1 (*) [32])(local_2c0 + lVar13));
                *(undefined1 (*) [32])(local_2c0 + lVar13) = auVar50;
                pauVar14 = (undefined1 (*) [32])(*pauVar14 + lVar23);
              }
            }
            iVar31 = iVar31 + iVar22;
            piVar16 = piVar16 + (int)(iVar22 * dst_stride);
            piVar15 = piVar15 + (int)(iVar22 * dst_stride);
          } while (iVar31 < v_end);
          auVar46 = vphaddd_avx2(local_2c0,local_2a0);
          auVar50 = vphaddd_avx2(local_280,local_260);
          auVar46 = vphaddd_avx2(auVar46,auVar50);
          auVar50 = vpmovsxdq_avx2(auVar46._0_16_);
          auVar46 = vpmovsxdq_avx2(auVar46._16_16_);
          auVar46 = vpaddq_avx2(auVar50,auVar46);
          *(undefined1 (*) [32])(H + local_180._0_8_ * 0x31 + uVar32 * 7) = auVar46;
          auVar46 = vphaddd_avx2(local_240,local_220);
          auVar50 = vphaddd_avx2(local_200,local_200);
          auVar46 = vphaddd_avx2(auVar46,auVar50);
          auVar50 = vpmovsxdq_avx2(auVar46._0_16_);
          auVar46 = vpmovsxdq_avx2(auVar46._16_16_);
          auVar46 = vpaddq_avx2(auVar50,auVar46);
          *(undefined1 (*) [32])(H + local_180._0_8_ * 0x31 + uVar32 * 7 + 4) = auVar46;
          lVar35 = lVar35 + 2;
        }
        local_180._0_8_ = local_180._0_8_ + 7;
        local_1c0._0_8_ = local_1c0._0_8_ + 2;
      }
      lVar13 = 6;
      lVar35 = 2;
      local_1c0._0_8_ = (long)(int)(dst_stride * 6);
      lVar28 = (long)(int)(dst_stride * 6);
      for (uVar33 = 0; uVar33 != 7; uVar33 = uVar33 + 1) {
        piVar16 = dgd_avg + (byte)(((ushort)lVar13 & 0xff) / 7);
        piVar25 = piVar16 + lVar28;
        auVar71 = ZEXT1664((undefined1  [16])0x0);
        piVar15 = piVar25;
        iVar31 = v_start;
        iVar22 = iVar37;
        do {
          iVar34 = v_end - iVar31;
          if (3 < v_end - iVar31) {
            iVar34 = iVar22;
          }
          if (use_downsampled_wiener_stats == 0) {
            iVar34 = iVar22;
          }
          iVar22 = iVar34;
          auVar72._0_2_ = (undefined2)iVar22;
          auVar72._2_2_ = auVar72._0_2_;
          auVar72._4_2_ = auVar72._0_2_;
          auVar72._6_2_ = auVar72._0_2_;
          auVar72._8_2_ = auVar72._0_2_;
          auVar72._10_2_ = auVar72._0_2_;
          auVar72._12_2_ = auVar72._0_2_;
          auVar72._14_2_ = auVar72._0_2_;
          auVar72._16_2_ = auVar72._0_2_;
          auVar72._18_2_ = auVar72._0_2_;
          auVar72._20_2_ = auVar72._0_2_;
          auVar72._22_2_ = auVar72._0_2_;
          auVar72._24_2_ = auVar72._0_2_;
          auVar72._26_2_ = auVar72._0_2_;
          auVar72._28_2_ = auVar72._0_2_;
          auVar72._30_2_ = auVar72._0_2_;
          for (lVar19 = 0; lVar19 < lVar41; lVar19 = lVar19 + 0x10) {
            auVar46 = vpmullw_avx2(auVar72,*(undefined1 (*) [32])(piVar15 + lVar19));
            auVar46 = vpmaddwd_avx2(auVar46,*(undefined1 (*) [32])(piVar16 + lVar28 + lVar19));
            auVar46 = vpaddd_avx2(auVar46,auVar71._0_32_);
            auVar71 = ZEXT3264(auVar46);
          }
          if (uVar18 != 0) {
            auVar46 = vpand_avx2(auVar43,*(undefined1 (*) [32])(piVar15 + lVar19));
            auVar46 = vpmullw_avx2(auVar72,auVar46);
            auVar46 = vpmaddwd_avx2(auVar46,*(undefined1 (*) [32])(piVar16 + lVar28 + lVar19));
            auVar46 = vpaddd_avx2(auVar46,auVar71._0_32_);
            auVar71 = ZEXT3264(auVar46);
          }
          iVar31 = iVar31 + iVar22;
          piVar16 = piVar16 + (int)(iVar22 * dst_stride);
          piVar15 = piVar15 + (int)(iVar22 * dst_stride);
        } while (iVar31 < v_end);
        auVar50 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar46 = vphaddd_avx2(auVar71._0_32_,auVar50);
        auVar46 = vphaddd_avx2(auVar46,auVar50);
        auVar53 = vpmovsxdq_avx(auVar46._16_16_);
        auVar1 = vpmovsxdq_avx(auVar46._0_16_);
        auVar53 = vpaddq_avx(auVar1,auVar53);
        H[lVar13 * 0x32] = auVar53._0_8_;
        local_180._0_8_ = lVar13;
        uVar32 = uVar33;
        lVar28 = lVar35;
        while (uVar32 < 6) {
          uVar32 = uVar32 + 1;
          local_200 = auVar50;
          local_220 = auVar50;
          local_240 = auVar50;
          local_260 = auVar50;
          local_280 = auVar50;
          local_2a0 = auVar50;
          local_2c0 = auVar50;
          piVar15 = piVar25;
          piVar16 = dgd_avg;
          iVar31 = v_start;
          iVar22 = iVar37;
          do {
            iVar34 = v_end - iVar31;
            if (3 < v_end - iVar31) {
              iVar34 = iVar22;
            }
            if (use_downsampled_wiener_stats == 0) {
              iVar34 = iVar22;
            }
            iVar22 = iVar34;
            auVar69._0_2_ = (undefined2)iVar22;
            auVar69._2_2_ = auVar69._0_2_;
            auVar69._4_2_ = auVar69._0_2_;
            auVar69._6_2_ = auVar69._0_2_;
            auVar69._8_2_ = auVar69._0_2_;
            auVar69._10_2_ = auVar69._0_2_;
            auVar69._12_2_ = auVar69._0_2_;
            auVar69._14_2_ = auVar69._0_2_;
            auVar69._16_2_ = auVar69._0_2_;
            auVar69._18_2_ = auVar69._0_2_;
            auVar69._20_2_ = auVar69._0_2_;
            auVar69._22_2_ = auVar69._0_2_;
            auVar69._24_2_ = auVar69._0_2_;
            auVar69._26_2_ = auVar69._0_2_;
            auVar69._28_2_ = auVar69._0_2_;
            auVar69._30_2_ = auVar69._0_2_;
            pauVar14 = (undefined1 (*) [32])((long)piVar16 + lVar28);
            for (uVar24 = 0; (long)uVar24 < lVar41; uVar24 = uVar24 + 0x10) {
              auVar46 = vpmullw_avx2(auVar69,*(undefined1 (*) [32])(piVar15 + uVar24));
              pauVar20 = pauVar14;
              for (lVar19 = 0; lVar19 != 0xe0; lVar19 = lVar19 + 0x20) {
                auVar2 = vpmaddwd_avx2(auVar46,*pauVar20);
                auVar2 = vpaddd_avx2(auVar2,*(undefined1 (*) [32])(local_2c0 + lVar19));
                *(undefined1 (*) [32])(local_2c0 + lVar19) = auVar2;
                pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar23);
              }
              pauVar14 = pauVar14 + 1;
            }
            if (uVar18 != 0) {
              auVar46 = vpand_avx2(auVar43,*(undefined1 (*) [32])(piVar15 + (uVar24 & 0xffffffff)));
              auVar46 = vpmullw_avx2(auVar69,auVar46);
              for (lVar19 = 0; lVar19 != 0xe0; lVar19 = lVar19 + 0x20) {
                auVar2 = vpmaddwd_avx2(auVar46,*pauVar14);
                auVar2 = vpaddd_avx2(auVar2,*(undefined1 (*) [32])(local_2c0 + lVar19));
                *(undefined1 (*) [32])(local_2c0 + lVar19) = auVar2;
                pauVar14 = (undefined1 (*) [32])(*pauVar14 + lVar23);
              }
            }
            iVar31 = iVar31 + iVar22;
            piVar16 = piVar16 + (int)(iVar22 * dst_stride);
            piVar15 = piVar15 + (int)(iVar22 * dst_stride);
          } while (iVar31 < v_end);
          auVar46 = vphaddd_avx2(local_2c0,local_2a0);
          auVar2 = vphaddd_avx2(local_280,local_260);
          auVar46 = vphaddd_avx2(auVar46,auVar2);
          auVar2 = vpmovsxdq_avx2(auVar46._0_16_);
          auVar46 = vpmovsxdq_avx2(auVar46._16_16_);
          auVar46 = vpaddq_avx2(auVar2,auVar46);
          *(undefined1 (*) [32])(H + lVar13 * 0x31 + uVar32 * 7) = auVar46;
          auVar46 = vphaddd_avx2(local_240,local_220);
          auVar2 = vphaddd_avx2(local_200,local_200);
          auVar46 = vphaddd_avx2(auVar46,auVar2);
          auVar2 = vpmovsxdq_avx2(auVar46._0_16_);
          auVar46 = vpmovsxdq_avx2(auVar46._16_16_);
          auVar46 = vpaddq_avx2(auVar2,auVar46);
          *(undefined1 (*) [32])(H + lVar13 * 0x31 + uVar32 * 7 + 4) = auVar46;
          lVar28 = lVar28 + 2;
        }
        lVar13 = lVar13 + 7;
        lVar35 = lVar35 + 2;
        lVar28 = local_1c0._0_8_;
      }
      local_1c8 = H + 6;
      lVar28 = 7;
      lVar35 = 6;
      for (lVar13 = 1; piVar29 = local_1c8, lVar13 != 7; lVar13 = lVar13 + 1) {
        piVar78 = H + lVar28 * 0x31;
        local_180._0_8_ = piVar78;
        lVar36 = 0;
        local_1c0._0_8_ = lVar13;
        lVar17 = 0;
        lVar19 = lVar13;
        do {
          local_200._0_16_ = ZEXT816(0);
          local_200 = ZEXT1632(local_200._0_16_);
          local_220._0_16_ = ZEXT816(0);
          local_220 = ZEXT1632(local_220._0_16_);
          local_240._0_16_ = ZEXT816(0);
          local_240 = ZEXT1632(local_240._0_16_);
          local_260._0_16_ = ZEXT816(0);
          local_260 = ZEXT1632(local_260._0_16_);
          local_280._0_16_ = ZEXT816(0);
          local_280 = ZEXT1632(local_280._0_16_);
          local_2a0._0_16_ = ZEXT816(0);
          local_2a0 = ZEXT1632(local_2a0._0_16_);
          local_2c0._0_16_ = ZEXT816(0);
          local_2c0 = ZEXT1632(local_2c0._0_16_);
          piVar16 = dgd_avg + (byte)(((ushort)lVar28 & 0xff) / 7);
          piVar25 = dgd_avg + (byte)(((ushort)lVar28 & 0xff) / 7);
          iVar31 = v_start;
          iVar22 = iVar37;
          do {
            iVar34 = v_end - iVar31;
            if (3 < v_end - iVar31) {
              iVar34 = iVar22;
            }
            if (use_downsampled_wiener_stats == 0) {
              iVar34 = iVar22;
            }
            iVar22 = iVar34;
            auVar70._0_2_ = (undefined2)iVar22;
            auVar70._2_2_ = auVar70._0_2_;
            auVar70._4_2_ = auVar70._0_2_;
            auVar70._6_2_ = auVar70._0_2_;
            auVar70._8_2_ = auVar70._0_2_;
            auVar70._10_2_ = auVar70._0_2_;
            auVar70._12_2_ = auVar70._0_2_;
            auVar70._14_2_ = auVar70._0_2_;
            auVar70._16_2_ = auVar70._0_2_;
            auVar70._18_2_ = auVar70._0_2_;
            auVar70._20_2_ = auVar70._0_2_;
            auVar70._22_2_ = auVar70._0_2_;
            auVar70._24_2_ = auVar70._0_2_;
            auVar70._26_2_ = auVar70._0_2_;
            auVar70._28_2_ = auVar70._0_2_;
            auVar70._30_2_ = auVar70._0_2_;
            pauVar14 = (undefined1 (*) [32])((long)piVar16 + lVar36);
            for (uVar33 = 0; (long)uVar33 < lVar41; uVar33 = uVar33 + 0x10) {
              auVar46 = vpmullw_avx2(auVar70,*(undefined1 (*) [32])(piVar25 + uVar33));
              pauVar20 = pauVar14;
              for (lVar26 = 0; lVar26 != 0xe0; lVar26 = lVar26 + 0x20) {
                auVar50 = vpmaddwd_avx2(auVar46,*pauVar20);
                auVar50 = vpaddd_avx2(auVar50,*(undefined1 (*) [32])(local_2c0 + lVar26));
                *(undefined1 (*) [32])(local_2c0 + lVar26) = auVar50;
                pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar23);
              }
              pauVar14 = pauVar14 + 1;
            }
            if (uVar18 != 0) {
              auVar46 = vpand_avx2(auVar43,*(undefined1 (*) [32])(piVar25 + (uVar33 & 0xffffffff)));
              auVar46 = vpmullw_avx2(auVar70,auVar46);
              for (lVar26 = 0; lVar26 != 0xe0; lVar26 = lVar26 + 0x20) {
                auVar50 = vpmaddwd_avx2(auVar46,*pauVar14);
                auVar50 = vpaddd_avx2(auVar50,*(undefined1 (*) [32])(local_2c0 + lVar26));
                *(undefined1 (*) [32])(local_2c0 + lVar26) = auVar50;
                pauVar14 = (undefined1 (*) [32])(*pauVar14 + lVar23);
              }
            }
            iVar31 = iVar31 + iVar22;
            piVar16 = piVar16 + (int)(iVar22 * dst_stride);
            piVar25 = piVar25 + (int)(iVar22 * dst_stride);
          } while (iVar31 < v_end);
          auVar46 = vphaddd_avx2(local_2c0,local_2a0);
          auVar50 = vphaddd_avx2(local_280,local_260);
          auVar46 = vphaddd_avx2(auVar46,auVar50);
          auVar2 = vpmovsxdq_avx2(auVar46._0_16_);
          auVar46 = vpmovsxdq_avx2(auVar46._16_16_);
          auVar50 = vphaddd_avx2(local_240,local_220);
          auVar46 = vpaddq_avx2(auVar2,auVar46);
          auVar2 = vphaddd_avx2(local_200,local_200);
          auVar50 = vphaddd_avx2(auVar50,auVar2);
          auVar2 = vpmovsxdq_avx2(auVar50._0_16_);
          auVar50 = vpmovsxdq_avx2(auVar50._16_16_);
          auVar50 = vpaddq_avx2(auVar2,auVar50);
          *(undefined1 (*) [32])(piVar78 + lVar19 * 7) = auVar46;
          *(undefined1 (*) [16])(piVar78 + lVar19 * 7 + 4) = auVar50._0_16_;
          piVar29[lVar28 * 0x31 + lVar19 * 7] = auVar50._16_8_;
          lVar17 = lVar17 + 1;
          lVar19 = lVar19 + 1;
          lVar36 = lVar36 + 2;
        } while (lVar17 != lVar35);
        lVar28 = lVar28 + 7;
        lVar35 = lVar35 + -1;
      }
      wiener_win2 = 0x31;
    }
    fill_lower_triag_elements_avx2(wiener_win2,H);
  }
  else {
    av1_compute_stats_c(wiener_win,dgd,src,dgd_avg,src_avg,h_start,h_end,v_start,v_end,dgd_stride,
                        src_stride,M,H,use_downsampled_wiener_stats);
  }
  return;
}

Assistant:

void av1_compute_stats_avx2(int wiener_win, const uint8_t *dgd,
                            const uint8_t *src, int16_t *dgd_avg,
                            int16_t *src_avg, int h_start, int h_end,
                            int v_start, int v_end, int dgd_stride,
                            int src_stride, int64_t *M, int64_t *H,
                            int use_downsampled_wiener_stats) {
  if (wiener_win != WIENER_WIN && wiener_win != WIENER_WIN_CHROMA) {
    // Currently, libaom supports Wiener filter processing with window sizes as
    // WIENER_WIN_CHROMA(5) and WIENER_WIN(7). For any other window size, SIMD
    // support is not facilitated. Hence, invoke C function for the same.
    av1_compute_stats_c(wiener_win, dgd, src, dgd_avg, src_avg, h_start, h_end,
                        v_start, v_end, dgd_stride, src_stride, M, H,
                        use_downsampled_wiener_stats);
    return;
  }

  const int32_t wiener_halfwin = wiener_win >> 1;
  const uint8_t avg =
      calc_dgd_buf_avg_avx2(dgd, h_start, h_end, v_start, v_end, dgd_stride);
  const int32_t width = h_end - h_start;
  const int32_t height = v_end - v_start;
  const int32_t d_stride = (width + 2 * wiener_halfwin + 15) & ~15;
  const int32_t s_stride = (width + 15) & ~15;

  // Based on the sf 'use_downsampled_wiener_stats', process either once for
  // UPDATE_DOWNSAMPLE_FACTOR or for each row.
  sub_avg_block_avx2(src + v_start * src_stride + h_start, src_stride, avg,
                     width, height, src_avg, s_stride,
                     use_downsampled_wiener_stats);

  // Compute (dgd-avg) buffer here which is used to fill H buffer.
  sub_avg_block_avx2(
      dgd + (v_start - wiener_halfwin) * dgd_stride + h_start - wiener_halfwin,
      dgd_stride, avg, width + 2 * wiener_halfwin, height + 2 * wiener_halfwin,
      dgd_avg, d_stride, 0);
  if (wiener_win == WIENER_WIN) {
    compute_stats_win7_avx2(dgd_avg, d_stride, src_avg, s_stride, width,
                            v_start, v_end, M, H, use_downsampled_wiener_stats);
  } else if (wiener_win == WIENER_WIN_CHROMA) {
    compute_stats_win5_avx2(dgd_avg, d_stride, src_avg, s_stride, width,
                            v_start, v_end, M, H, use_downsampled_wiener_stats);
  }
}